

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiMBIntersector1<8>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [12];
  ulong uVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  byte bVar77;
  uint uVar78;
  ulong uVar79;
  ulong uVar80;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar81;
  uint uVar82;
  long lVar83;
  ulong uVar84;
  undefined4 uVar89;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  long lVar85;
  byte bVar86;
  bool bVar87;
  float fVar88;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar92 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar116 [16];
  float fVar114;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined8 uVar115;
  float fVar138;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar137;
  float fVar139;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  undefined1 auVar150 [16];
  float fVar160;
  float fVar161;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar151 [32];
  undefined1 auVar144 [16];
  float fVar162;
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar190;
  float fVar191;
  float fVar192;
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar189;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar193 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [28];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [64];
  undefined1 auVar229 [32];
  undefined1 auVar228 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [64];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [28];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  float fVar253;
  float fVar261;
  float fVar262;
  undefined1 auVar254 [16];
  float fVar264;
  float fVar265;
  float fVar266;
  undefined1 auVar255 [32];
  float fVar263;
  float fVar267;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [64];
  float fVar268;
  undefined1 auVar269 [16];
  float fVar274;
  undefined1 auVar270 [32];
  float fVar272;
  float fVar273;
  undefined1 auVar271 [64];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  float fVar290;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b84;
  int local_ac4;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined8 local_9a0;
  undefined4 local_998;
  float local_994;
  undefined4 local_990;
  undefined4 local_98c;
  uint local_988;
  uint local_984;
  uint local_980;
  ulong local_968;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined8 local_840;
  undefined4 uStack_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 local_7e0 [16];
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_550 [16];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar7 = prim[1];
  uVar79 = (ulong)(byte)PVar7;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar105 = vpmovsxbd_avx2(auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar103 = vpmovsxbd_avx2(auVar5);
  auVar199._8_8_ = 0;
  auVar199._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar132 = vpmovsxbd_avx2(auVar199);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar79 * 0xf + 6);
  auVar13 = vpmovsxbd_avx2(auVar6);
  lVar83 = uVar79 * 0x25;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar7;
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar14 = vpmovsxbd_avx2(auVar195);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar79 * 0x11 + 6);
  auVar15 = vpmovsxbd_avx2(auVar98);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar79 * 0x1a + 6);
  auVar102 = vpmovsxbd_avx2(auVar94);
  auVar241._8_8_ = 0;
  auVar241._0_8_ = *(ulong *)(prim + uVar79 * 0x1b + 6);
  auVar152 = vpmovsxbd_avx2(auVar241);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar79 * 0x1c + 6);
  auVar16 = vpmovsxbd_avx2(auVar149);
  auVar4 = vsubps_avx((undefined1  [16])(ray->org).field_0,*(undefined1 (*) [16])(prim + lVar83 + 6)
                     );
  fVar88 = *(float *)(prim + lVar83 + 0x12);
  fVar253 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar83 + 0x16)) *
            *(float *)(prim + lVar83 + 0x1a);
  auVar146._0_4_ = fVar88 * auVar4._0_4_;
  auVar146._4_4_ = fVar88 * auVar4._4_4_;
  auVar146._8_4_ = fVar88 * auVar4._8_4_;
  auVar146._12_4_ = fVar88 * auVar4._12_4_;
  auVar254._0_4_ = fVar88 * (ray->dir).field_0.m128[0];
  auVar254._4_4_ = fVar88 * (ray->dir).field_0.m128[1];
  auVar254._8_4_ = fVar88 * (ray->dir).field_0.m128[2];
  auVar254._12_4_ = fVar88 * (ray->dir).field_0.m128[3];
  auVar103 = vcvtdq2ps_avx(auVar103);
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar154 = vcvtdq2ps_avx(auVar152);
  auVar206 = vcvtdq2ps_avx(auVar16);
  auVar4 = vmovshdup_avx(auVar254);
  auVar202._0_8_ = auVar4._0_8_;
  auVar202._8_8_ = auVar202._0_8_;
  auVar202._16_8_ = auVar202._0_8_;
  auVar202._24_8_ = auVar202._0_8_;
  auVar4 = vshufps_avx(auVar254,auVar254,0xaa);
  fVar88 = auVar4._0_4_;
  fVar143 = auVar4._4_4_;
  auVar17._4_4_ = fVar143 * auVar132._4_4_;
  auVar17._0_4_ = fVar88 * auVar132._0_4_;
  auVar17._8_4_ = fVar88 * auVar132._8_4_;
  auVar17._12_4_ = fVar143 * auVar132._12_4_;
  auVar17._16_4_ = fVar88 * auVar132._16_4_;
  auVar17._20_4_ = fVar143 * auVar132._20_4_;
  auVar17._24_4_ = fVar88 * auVar132._24_4_;
  auVar17._28_4_ = auVar16._28_4_;
  auVar16._4_4_ = fVar143 * auVar15._4_4_;
  auVar16._0_4_ = fVar88 * auVar15._0_4_;
  auVar16._8_4_ = fVar88 * auVar15._8_4_;
  auVar16._12_4_ = fVar143 * auVar15._12_4_;
  auVar16._16_4_ = fVar88 * auVar15._16_4_;
  auVar16._20_4_ = fVar143 * auVar15._20_4_;
  auVar16._24_4_ = fVar88 * auVar15._24_4_;
  auVar16._28_4_ = auVar152._28_4_;
  auVar152._4_4_ = auVar206._4_4_ * fVar143;
  auVar152._0_4_ = auVar206._0_4_ * fVar88;
  auVar152._8_4_ = auVar206._8_4_ * fVar88;
  auVar152._12_4_ = auVar206._12_4_ * fVar143;
  auVar152._16_4_ = auVar206._16_4_ * fVar88;
  auVar152._20_4_ = auVar206._20_4_ * fVar143;
  auVar152._24_4_ = auVar206._24_4_ * fVar88;
  auVar152._28_4_ = fVar143;
  auVar5 = vfmadd231ps_fma(auVar17,auVar202,auVar103);
  auVar199 = vfmadd231ps_fma(auVar16,auVar202,auVar14);
  auVar6 = vfmadd231ps_fma(auVar152,auVar154,auVar202);
  auVar4 = vshufps_avx(auVar146,auVar146,0xaa);
  fVar88 = auVar4._0_4_;
  auVar203._0_4_ = fVar88 * auVar132._0_4_;
  fVar143 = auVar4._4_4_;
  auVar203._4_4_ = fVar143 * auVar132._4_4_;
  auVar203._8_4_ = fVar88 * auVar132._8_4_;
  auVar203._12_4_ = fVar143 * auVar132._12_4_;
  auVar203._16_4_ = fVar88 * auVar132._16_4_;
  auVar203._20_4_ = fVar143 * auVar132._20_4_;
  auVar203._24_4_ = fVar88 * auVar132._24_4_;
  auVar203._28_4_ = 0;
  auVar18._4_4_ = fVar143 * auVar15._4_4_;
  auVar18._0_4_ = fVar88 * auVar15._0_4_;
  auVar18._8_4_ = fVar88 * auVar15._8_4_;
  auVar18._12_4_ = fVar143 * auVar15._12_4_;
  auVar18._16_4_ = fVar88 * auVar15._16_4_;
  auVar18._20_4_ = fVar143 * auVar15._20_4_;
  auVar18._24_4_ = fVar88 * auVar15._24_4_;
  auVar18._28_4_ = auVar132._28_4_;
  auVar132._4_4_ = auVar206._4_4_ * fVar143;
  auVar132._0_4_ = auVar206._0_4_ * fVar88;
  auVar132._8_4_ = auVar206._8_4_ * fVar88;
  auVar132._12_4_ = auVar206._12_4_ * fVar143;
  auVar132._16_4_ = auVar206._16_4_ * fVar88;
  auVar132._20_4_ = auVar206._20_4_ * fVar143;
  auVar132._24_4_ = auVar206._24_4_ * fVar88;
  auVar132._28_4_ = auVar206._28_4_;
  auVar4 = vmovshdup_avx(auVar146);
  auVar101._0_8_ = auVar4._0_8_;
  auVar101._8_8_ = auVar101._0_8_;
  auVar101._16_8_ = auVar101._0_8_;
  auVar101._24_8_ = auVar101._0_8_;
  auVar4 = vfmadd231ps_fma(auVar203,auVar101,auVar103);
  local_820 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar195 = vfmadd231ps_fma(auVar18,auVar101,auVar14);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0xb + 6));
  auVar98 = vfmadd231ps_fma(auVar132,auVar101,auVar154);
  auVar154 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar206 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0xd + 6));
  auVar103 = vcvtdq2ps_avx(auVar105);
  auVar132 = vcvtdq2ps_avx(auVar13);
  auVar14 = vcvtdq2ps_avx(auVar102);
  auVar255._4_4_ = auVar254._0_4_;
  auVar255._0_4_ = auVar254._0_4_;
  auVar255._8_4_ = auVar254._0_4_;
  auVar255._12_4_ = auVar254._0_4_;
  auVar255._16_4_ = auVar254._0_4_;
  auVar255._20_4_ = auVar254._0_4_;
  auVar255._24_4_ = auVar254._0_4_;
  auVar255._28_4_ = auVar254._0_4_;
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar255,auVar103);
  auVar199 = vfmadd231ps_fma(ZEXT1632(auVar199),auVar255,auVar132);
  auVar254 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar14,auVar255);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x12 + 6));
  auVar237._4_4_ = auVar146._0_4_;
  auVar237._0_4_ = auVar146._0_4_;
  auVar237._8_4_ = auVar146._0_4_;
  auVar237._12_4_ = auVar146._0_4_;
  auVar237._16_4_ = auVar146._0_4_;
  auVar237._20_4_ = auVar146._0_4_;
  auVar237._24_4_ = auVar146._0_4_;
  auVar237._28_4_ = auVar146._0_4_;
  auVar146 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar237,auVar103);
  auVar13 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x16 + 6));
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar237,auVar132);
  local_920 = ZEXT1632(auVar4);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar237,auVar14);
  local_6a0._8_4_ = 0x7fffffff;
  local_6a0._0_8_ = 0x7fffffff7fffffff;
  local_6a0._12_4_ = 0x7fffffff;
  local_6a0._16_4_ = 0x7fffffff;
  local_6a0._20_4_ = 0x7fffffff;
  local_6a0._24_4_ = 0x7fffffff;
  local_6a0._28_4_ = 0x7fffffff;
  auVar103 = vandps_avx(ZEXT1632(auVar5),local_6a0);
  auVar181._8_4_ = 0x219392ef;
  auVar181._0_8_ = 0x219392ef219392ef;
  auVar181._12_4_ = 0x219392ef;
  auVar181._16_4_ = 0x219392ef;
  auVar181._20_4_ = 0x219392ef;
  auVar181._24_4_ = 0x219392ef;
  auVar181._28_4_ = 0x219392ef;
  auVar103 = vcmpps_avx(auVar103,auVar181,1);
  auVar132 = vblendvps_avx(ZEXT1632(auVar5),auVar181,auVar103);
  auVar103 = vandps_avx(ZEXT1632(auVar199),local_6a0);
  auVar103 = vcmpps_avx(auVar103,auVar181,1);
  auVar14 = vblendvps_avx(ZEXT1632(auVar199),auVar181,auVar103);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x14 + 6));
  auVar222._4_4_ = fVar253;
  auVar222._0_4_ = fVar253;
  auVar222._8_4_ = fVar253;
  auVar222._12_4_ = fVar253;
  auVar222._16_4_ = fVar253;
  auVar222._20_4_ = fVar253;
  auVar222._24_4_ = fVar253;
  auVar222._28_4_ = fVar253;
  auVar103 = vcvtdq2ps_avx(local_820);
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar6 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar154);
  auVar15 = vcvtdq2ps_avx(auVar206);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar195 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar105);
  auVar15 = vcvtdq2ps_avx(auVar13);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar98 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar102);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x18 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar154 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x1d + 6));
  auVar94 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar154);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x21 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar154 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x1f + 6));
  auVar241 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar103 = vcvtdq2ps_avx(auVar154);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x23 + 6));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar15 = vsubps_avx(auVar15,auVar103);
  auVar149 = vfmadd213ps_fma(auVar15,auVar222,auVar103);
  auVar260 = ZEXT1664(auVar149);
  auVar103 = vandps_avx(ZEXT1632(auVar254),local_6a0);
  auVar103 = vcmpps_avx(auVar103,auVar181,1);
  auVar15 = vrcpps_avx(auVar132);
  auVar103 = vblendvps_avx(ZEXT1632(auVar254),auVar181,auVar103);
  auVar129._8_4_ = 0x3f800000;
  auVar129._0_8_ = 0x3f8000003f800000;
  auVar129._12_4_ = 0x3f800000;
  auVar129._16_4_ = 0x3f800000;
  auVar129._20_4_ = 0x3f800000;
  auVar129._24_4_ = 0x3f800000;
  auVar129._28_4_ = 0x3f800000;
  auVar4 = vfnmadd213ps_fma(auVar132,auVar15,auVar129);
  auVar132 = vrcpps_avx(auVar14);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar15,auVar15);
  auVar15 = vrcpps_avx(auVar103);
  auVar5 = vfnmadd213ps_fma(auVar14,auVar132,auVar129);
  auVar5 = vfmadd132ps_fma(ZEXT1632(auVar5),auVar132,auVar132);
  auVar199 = vfnmadd213ps_fma(auVar103,auVar15,auVar129);
  auVar199 = vfmadd132ps_fma(ZEXT1632(auVar199),auVar15,auVar15);
  auVar103 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar146));
  auVar14._4_4_ = auVar4._4_4_ * auVar103._4_4_;
  auVar14._0_4_ = auVar4._0_4_ * auVar103._0_4_;
  auVar14._8_4_ = auVar4._8_4_ * auVar103._8_4_;
  auVar14._12_4_ = auVar4._12_4_ * auVar103._12_4_;
  auVar14._16_4_ = auVar103._16_4_ * 0.0;
  auVar14._20_4_ = auVar103._20_4_ * 0.0;
  auVar14._24_4_ = auVar103._24_4_ * 0.0;
  auVar14._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar195),ZEXT1632(auVar146));
  auVar15._4_4_ = auVar4._4_4_ * auVar103._4_4_;
  auVar15._0_4_ = auVar4._0_4_ * auVar103._0_4_;
  auVar15._8_4_ = auVar4._8_4_ * auVar103._8_4_;
  auVar15._12_4_ = auVar4._12_4_ * auVar103._12_4_;
  auVar15._16_4_ = auVar103._16_4_ * 0.0;
  auVar15._20_4_ = auVar103._20_4_ * 0.0;
  auVar15._24_4_ = auVar103._24_4_ * 0.0;
  auVar15._28_4_ = 0x3f800000;
  auVar103 = vsubps_avx(ZEXT1632(auVar98),local_920);
  auVar154._4_4_ = auVar5._4_4_ * auVar103._4_4_;
  auVar154._0_4_ = auVar5._0_4_ * auVar103._0_4_;
  auVar154._8_4_ = auVar5._8_4_ * auVar103._8_4_;
  auVar154._12_4_ = auVar5._12_4_ * auVar103._12_4_;
  auVar154._16_4_ = auVar103._16_4_ * 0.0;
  auVar154._20_4_ = auVar103._20_4_ * 0.0;
  auVar154._24_4_ = auVar103._24_4_ * 0.0;
  auVar154._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar94),local_920);
  auVar102._0_4_ = auVar5._0_4_ * auVar103._0_4_;
  auVar102._4_4_ = auVar5._4_4_ * auVar103._4_4_;
  auVar102._8_4_ = auVar5._8_4_ * auVar103._8_4_;
  auVar102._12_4_ = auVar5._12_4_ * auVar103._12_4_;
  auVar102._16_4_ = auVar103._16_4_ * 0.0;
  auVar102._20_4_ = auVar103._20_4_ * 0.0;
  auVar102._24_4_ = auVar103._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar103 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar90));
  auVar206._4_4_ = auVar199._4_4_ * auVar103._4_4_;
  auVar206._0_4_ = auVar199._0_4_ * auVar103._0_4_;
  auVar206._8_4_ = auVar199._8_4_ * auVar103._8_4_;
  auVar206._12_4_ = auVar199._12_4_ * auVar103._12_4_;
  auVar206._16_4_ = auVar103._16_4_ * 0.0;
  auVar206._20_4_ = auVar103._20_4_ * 0.0;
  auVar206._24_4_ = auVar103._24_4_ * 0.0;
  auVar206._28_4_ = auVar103._28_4_;
  auVar103 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar90));
  auVar105._4_4_ = auVar199._4_4_ * auVar103._4_4_;
  auVar105._0_4_ = auVar199._0_4_ * auVar103._0_4_;
  auVar105._8_4_ = auVar199._8_4_ * auVar103._8_4_;
  auVar105._12_4_ = auVar199._12_4_ * auVar103._12_4_;
  auVar105._16_4_ = auVar103._16_4_ * 0.0;
  auVar105._20_4_ = auVar103._20_4_ * 0.0;
  auVar105._24_4_ = auVar103._24_4_ * 0.0;
  auVar105._28_4_ = auVar103._28_4_;
  auVar103 = vpminsd_avx2(auVar14,auVar15);
  auVar132 = vpminsd_avx2(auVar154,auVar102);
  auVar103 = vmaxps_avx(auVar103,auVar132);
  auVar132 = vpminsd_avx2(auVar206,auVar105);
  uVar89 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar244._4_4_ = uVar89;
  auVar244._0_4_ = uVar89;
  auVar244._8_4_ = uVar89;
  auVar244._12_4_ = uVar89;
  auVar244._16_4_ = uVar89;
  auVar244._20_4_ = uVar89;
  auVar244._24_4_ = uVar89;
  auVar244._28_4_ = uVar89;
  auVar132 = vmaxps_avx(auVar132,auVar244);
  auVar103 = vmaxps_avx(auVar103,auVar132);
  local_3c0._4_4_ = auVar103._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar103._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar103._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar103._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar103._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar103._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar103._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar103._28_4_;
  auVar103 = vpmaxsd_avx2(auVar14,auVar15);
  auVar132 = vpmaxsd_avx2(auVar154,auVar102);
  auVar103 = vminps_avx(auVar103,auVar132);
  auVar132 = vpmaxsd_avx2(auVar206,auVar105);
  fVar88 = ray->tfar;
  auVar151._4_4_ = fVar88;
  auVar151._0_4_ = fVar88;
  auVar151._8_4_ = fVar88;
  auVar151._12_4_ = fVar88;
  auVar151._16_4_ = fVar88;
  auVar151._20_4_ = fVar88;
  auVar151._24_4_ = fVar88;
  auVar151._28_4_ = fVar88;
  auVar132 = vminps_avx(auVar132,auVar151);
  auVar103 = vminps_avx(auVar103,auVar132);
  auVar13._4_4_ = auVar103._4_4_ * 1.0000004;
  auVar13._0_4_ = auVar103._0_4_ * 1.0000004;
  auVar13._8_4_ = auVar103._8_4_ * 1.0000004;
  auVar13._12_4_ = auVar103._12_4_ * 1.0000004;
  auVar13._16_4_ = auVar103._16_4_ * 1.0000004;
  auVar13._20_4_ = auVar103._20_4_ * 1.0000004;
  auVar13._24_4_ = auVar103._24_4_ * 1.0000004;
  auVar13._28_4_ = auVar103._28_4_;
  auVar130[4] = PVar7;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar7;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar7;
  auVar130._13_3_ = 0;
  auVar130[0x10] = PVar7;
  auVar130._17_3_ = 0;
  auVar130[0x14] = PVar7;
  auVar130._21_3_ = 0;
  auVar130[0x18] = PVar7;
  auVar130._25_3_ = 0;
  auVar130[0x1c] = PVar7;
  auVar130._29_3_ = 0;
  auVar103 = vcmpps_avx(local_3c0,auVar13,2);
  auVar132 = vpcmpgtd_avx2(auVar130,_DAT_01fb4ba0);
  auVar103 = vandps_avx(auVar103,auVar132);
  uVar81 = vmovmskps_avx(auVar103);
  auVar103._16_16_ = mm_lookupmask_ps._240_16_;
  auVar103._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar103,ZEXT832(0) << 0x20,0x80);
LAB_013c8b9e:
  local_7c8 = (ulong)uVar81;
  if (local_7c8 == 0) {
LAB_013cb122:
    return local_7c8 != 0;
  }
  lVar83 = 0;
  for (uVar79 = local_7c8; (uVar79 & 1) == 0; uVar79 = uVar79 >> 1 | 0x8000000000000000) {
    lVar83 = lVar83 + 1;
  }
  uVar81 = *(uint *)(prim + 2);
  local_968 = (ulong)*(uint *)(prim + lVar83 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar81].ptr;
  uVar79 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           local_968 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar88 = (pGVar8->time_range).lower;
  fVar88 = pGVar8->fnumTimeSegments *
           (((ray->dir).field_0.m128[3] - fVar88) / ((pGVar8->time_range).upper - fVar88));
  auVar4 = vroundss_avx(ZEXT416((uint)fVar88),ZEXT416((uint)fVar88),9);
  auVar4 = vminss_avx(auVar4,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar4 = vmaxss_avx(ZEXT816(0) << 0x20,auVar4);
  fVar88 = fVar88 - auVar4._0_4_;
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar85 = (long)(int)auVar4._0_4_ * 0x38;
  lVar83 = *(long *)(_Var9 + 0x10 + lVar85);
  lVar10 = *(long *)(_Var9 + 0x38 + lVar85);
  lVar11 = *(long *)(_Var9 + 0x48 + lVar85);
  pfVar1 = (float *)(lVar10 + uVar79 * lVar11);
  auVar116._0_4_ = fVar88 * *pfVar1;
  auVar116._4_4_ = fVar88 * pfVar1[1];
  auVar116._8_4_ = fVar88 * pfVar1[2];
  auVar116._12_4_ = fVar88 * pfVar1[3];
  pfVar1 = (float *)(lVar10 + (uVar79 + 1) * lVar11);
  auVar144._0_4_ = fVar88 * *pfVar1;
  auVar144._4_4_ = fVar88 * pfVar1[1];
  auVar144._8_4_ = fVar88 * pfVar1[2];
  auVar144._12_4_ = fVar88 * pfVar1[3];
  pfVar1 = (float *)(lVar10 + (uVar79 + 2) * lVar11);
  auVar193._0_4_ = fVar88 * *pfVar1;
  auVar193._4_4_ = fVar88 * pfVar1[1];
  auVar193._8_4_ = fVar88 * pfVar1[2];
  auVar193._12_4_ = fVar88 * pfVar1[3];
  pfVar1 = (float *)(lVar10 + lVar11 * (uVar79 + 3));
  auVar166._0_4_ = fVar88 * *pfVar1;
  auVar166._4_4_ = fVar88 * pfVar1[1];
  auVar166._8_4_ = fVar88 * pfVar1[2];
  auVar166._12_4_ = fVar88 * pfVar1[3];
  lVar10 = *(long *)(_Var9 + lVar85);
  fVar88 = 1.0 - fVar88;
  auVar90._4_4_ = fVar88;
  auVar90._0_4_ = fVar88;
  auVar90._8_4_ = fVar88;
  auVar90._12_4_ = fVar88;
  auVar6 = vfmadd231ps_fma(auVar116,auVar90,*(undefined1 (*) [16])(lVar10 + lVar83 * uVar79));
  auVar195 = vfmadd231ps_fma(auVar144,auVar90,*(undefined1 (*) [16])(lVar10 + lVar83 * (uVar79 + 1))
                            );
  auVar98 = vfmadd231ps_fma(auVar193,auVar90,*(undefined1 (*) [16])(lVar10 + lVar83 * (uVar79 + 2)))
  ;
  auVar94 = vfmadd231ps_fma(auVar166,auVar90,*(undefined1 (*) [16])(lVar10 + lVar83 * (uVar79 + 3)))
  ;
  auVar209._0_4_ = (auVar6._0_4_ + auVar195._0_4_ + auVar98._0_4_ + auVar94._0_4_) * 0.25;
  auVar209._4_4_ = (auVar6._4_4_ + auVar195._4_4_ + auVar98._4_4_ + auVar94._4_4_) * 0.25;
  auVar209._8_4_ = (auVar6._8_4_ + auVar195._8_4_ + auVar98._8_4_ + auVar94._8_4_) * 0.25;
  auVar209._12_4_ = (auVar6._12_4_ + auVar195._12_4_ + auVar98._12_4_ + auVar94._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar4 = vsubps_avx(auVar209,(undefined1  [16])aVar2);
  auVar4 = vdpps_avx(auVar4,(undefined1  [16])aVar3,0x7f);
  auVar5 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar199 = vrcpss_avx(auVar5,auVar5);
  auVar5 = vfnmadd213ss_fma(auVar199,auVar5,ZEXT416(0x40000000));
  fVar88 = auVar4._0_4_ * auVar199._0_4_ * auVar5._0_4_;
  local_7e0 = ZEXT416((uint)fVar88);
  auVar210._4_4_ = fVar88;
  auVar210._0_4_ = fVar88;
  auVar210._8_4_ = fVar88;
  auVar210._12_4_ = fVar88;
  fStack_670 = fVar88;
  _local_680 = auVar210;
  fStack_66c = fVar88;
  fStack_668 = fVar88;
  fStack_664 = fVar88;
  auVar4 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar210);
  auVar4 = vblendps_avx(auVar4,_DAT_01f45a50,8);
  auVar199 = vsubps_avx(auVar6,auVar4);
  auVar6 = vsubps_avx(auVar98,auVar4);
  auVar236 = ZEXT1664(auVar6);
  auVar195 = vsubps_avx(auVar195,auVar4);
  _local_a80 = vsubps_avx(auVar94,auVar4);
  auVar4 = vmovshdup_avx(auVar199);
  uVar115 = auVar4._0_8_;
  local_8a0._8_8_ = uVar115;
  local_8a0._0_8_ = uVar115;
  local_8a0._16_8_ = uVar115;
  local_8a0._24_8_ = uVar115;
  auVar271 = ZEXT3264(local_8a0);
  auVar4 = vshufps_avx(auVar199,auVar199,0xaa);
  uVar115 = auVar4._0_8_;
  auVar275._8_8_ = uVar115;
  auVar275._0_8_ = uVar115;
  auVar275._16_8_ = uVar115;
  auVar275._24_8_ = uVar115;
  auVar4 = vshufps_avx(auVar199,auVar199,0xff);
  uVar115 = auVar4._0_8_;
  auVar238._8_8_ = uVar115;
  auVar238._0_8_ = uVar115;
  auVar238._16_8_ = uVar115;
  auVar238._24_8_ = uVar115;
  auVar4 = vmovshdup_avx(auVar195);
  uVar115 = auVar4._0_8_;
  auVar245._8_8_ = uVar115;
  auVar245._0_8_ = uVar115;
  auVar245._16_8_ = uVar115;
  auVar245._24_8_ = uVar115;
  auVar4 = vshufps_avx(auVar195,auVar195,0xaa);
  uVar115 = auVar4._0_8_;
  local_aa0._8_8_ = uVar115;
  local_aa0._0_8_ = uVar115;
  local_aa0._16_8_ = uVar115;
  local_aa0._24_8_ = uVar115;
  auVar219 = ZEXT3264(local_aa0);
  auVar5 = vshufps_avx(auVar195,auVar195,0xff);
  uVar115 = auVar5._0_8_;
  auVar287._8_8_ = uVar115;
  auVar287._0_8_ = uVar115;
  auVar287._16_8_ = uVar115;
  auVar287._24_8_ = uVar115;
  auVar4 = vmovshdup_avx(auVar6);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar6,auVar6,0xaa);
  local_480 = auVar4._0_4_;
  fStack_47c = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar6,auVar6,0xff);
  local_4a0 = auVar4._0_4_;
  fStack_49c = auVar4._4_4_;
  auVar4 = vmovshdup_avx(_local_a80);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(_local_a80,_local_a80,0xaa);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(_local_a80,_local_a80,0xff);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar91._0_4_ = aVar3.x * aVar3.x;
  auVar91._4_4_ = aVar3.y * aVar3.y;
  auVar91._8_4_ = aVar3.z * aVar3.z;
  auVar91._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar4 = vshufps_avx(auVar91,auVar91,0xaa);
  uVar89 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_580._4_4_ = uVar89;
  local_580._0_4_ = uVar89;
  fStack_578 = (float)uVar89;
  fStack_574 = (float)uVar89;
  fStack_570 = (float)uVar89;
  fStack_56c = (float)uVar89;
  fStack_568 = (float)uVar89;
  register0x0000125c = uVar89;
  auVar104._0_8_ = auVar4._0_8_;
  auVar104._8_8_ = auVar104._0_8_;
  auVar104._16_8_ = auVar104._0_8_;
  auVar104._24_8_ = auVar104._0_8_;
  auVar4 = vfmadd231ps_fma(auVar104,_local_580,_local_580);
  uVar89 = *(undefined4 *)&(ray->dir).field_0;
  local_5a0._4_4_ = uVar89;
  local_5a0._0_4_ = uVar89;
  fStack_598 = (float)uVar89;
  fStack_594 = (float)uVar89;
  fStack_590 = (float)uVar89;
  fStack_58c = (float)uVar89;
  fStack_588 = (float)uVar89;
  register0x0000125c = uVar89;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5a0,_local_5a0);
  uVar79 = 0;
  bVar86 = 0;
  local_b84 = 1;
  local_5c0 = (ray->dir).field_0.m128[2];
  local_920._0_16_ = auVar199;
  uVar89 = auVar199._0_4_;
  local_3a0._4_4_ = uVar89;
  local_3a0._0_4_ = uVar89;
  local_3a0._8_4_ = uVar89;
  local_3a0._12_4_ = uVar89;
  local_3a0._16_4_ = uVar89;
  local_3a0._20_4_ = uVar89;
  local_3a0._24_4_ = uVar89;
  local_3a0._28_4_ = uVar89;
  local_820._0_16_ = auVar195;
  uVar89 = auVar195._0_4_;
  local_a40._4_4_ = uVar89;
  local_a40._0_4_ = uVar89;
  local_a40._8_4_ = uVar89;
  local_a40._12_4_ = uVar89;
  local_a40._16_4_ = uVar89;
  local_a40._20_4_ = uVar89;
  local_a40._24_4_ = uVar89;
  local_a40._28_4_ = uVar89;
  auVar227 = ZEXT3264(local_a40);
  fVar88 = auVar6._0_4_;
  local_280 = fVar88;
  fStack_27c = fVar88;
  fStack_278 = fVar88;
  fStack_274 = fVar88;
  fStack_270 = fVar88;
  fStack_26c = fVar88;
  fStack_268 = fVar88;
  fStack_264 = fVar88;
  local_2a0 = local_a80._0_4_;
  fStack_29c = local_2a0;
  fStack_298 = local_2a0;
  fStack_294 = local_2a0;
  fStack_290 = local_2a0;
  fStack_28c = local_2a0;
  fStack_288 = local_2a0;
  fStack_284 = local_2a0;
  local_260 = ZEXT1632(auVar4);
  local_4c0 = vandps_avx(ZEXT1632(auVar4),local_6a0);
  local_550 = ZEXT816(0x3f80000000000000);
  local_a20 = auVar238;
  local_8e0 = auVar245;
  local_8c0 = auVar275;
  fStack_5bc = local_5c0;
  fStack_5b8 = local_5c0;
  fStack_5b4 = local_5c0;
  fStack_5b0 = local_5c0;
  fStack_5ac = local_5c0;
  fStack_5a8 = local_5c0;
  fStack_5a4 = local_5c0;
  fStack_498 = local_4a0;
  fStack_494 = fStack_49c;
  fStack_490 = local_4a0;
  fStack_48c = fStack_49c;
  fStack_488 = local_4a0;
  fStack_484 = fStack_49c;
  fStack_478 = local_480;
  fStack_474 = fStack_47c;
  fStack_470 = local_480;
  fStack_46c = fStack_47c;
  fStack_468 = local_480;
  fStack_464 = fStack_47c;
  do {
    auVar182._8_4_ = 0x3f800000;
    auVar182._0_8_ = 0x3f8000003f800000;
    auVar182._12_4_ = 0x3f800000;
    auVar182._16_4_ = 0x3f800000;
    auVar182._20_4_ = 0x3f800000;
    auVar182._24_4_ = 0x3f800000;
    auVar182._28_4_ = 0x3f800000;
    auVar4 = vmovshdup_avx(local_550);
    auVar4 = vsubps_avx(auVar4,local_550);
    fVar262 = auVar4._0_4_;
    fVar165 = fVar262 * 0.04761905;
    local_900._0_4_ = local_550._0_4_;
    local_900._4_4_ = local_900._0_4_;
    local_900._8_4_ = local_900._0_4_;
    local_900._12_4_ = local_900._0_4_;
    local_900._16_4_ = local_900._0_4_;
    local_900._20_4_ = local_900._0_4_;
    local_900._24_4_ = local_900._0_4_;
    local_900._28_4_ = local_900._0_4_;
    local_700._4_4_ = fVar262;
    local_700._0_4_ = fVar262;
    local_700._8_4_ = fVar262;
    local_700._12_4_ = fVar262;
    local_700._16_4_ = fVar262;
    local_700._20_4_ = fVar262;
    local_700._24_4_ = fVar262;
    local_700._28_4_ = fVar262;
    auVar4 = vfmadd231ps_fma(local_900,local_700,_DAT_01f7b040);
    auVar103 = vsubps_avx(auVar182,ZEXT1632(auVar4));
    fVar253 = auVar4._0_4_;
    auVar281._0_4_ = auVar227._0_4_ * fVar253;
    fVar143 = auVar4._4_4_;
    auVar281._4_4_ = auVar227._4_4_ * fVar143;
    fVar261 = auVar4._8_4_;
    auVar281._8_4_ = auVar227._8_4_ * fVar261;
    fVar160 = auVar4._12_4_;
    auVar281._12_4_ = auVar227._12_4_ * fVar160;
    auVar281._16_4_ = auVar227._16_4_ * 0.0;
    auVar281._20_4_ = auVar227._20_4_ * 0.0;
    auVar281._28_36_ = auVar260._28_36_;
    auVar281._24_4_ = auVar227._24_4_ * 0.0;
    auVar75._4_4_ = auVar245._4_4_ * fVar143;
    auVar75._0_4_ = auVar245._0_4_ * fVar253;
    auVar75._8_4_ = auVar245._8_4_ * fVar261;
    auVar75._12_4_ = auVar245._12_4_ * fVar160;
    auVar75._16_4_ = auVar245._16_4_ * 0.0;
    auVar75._20_4_ = auVar245._20_4_ * 0.0;
    auVar75._24_4_ = auVar245._24_4_ * 0.0;
    auVar75._28_4_ = DAT_01f7b040._28_4_;
    auVar249._0_4_ = auVar219._0_4_ * fVar253;
    auVar249._4_4_ = auVar219._4_4_ * fVar143;
    auVar249._8_4_ = auVar219._8_4_ * fVar261;
    auVar249._12_4_ = auVar219._12_4_ * fVar160;
    auVar249._16_4_ = auVar219._16_4_ * 0.0;
    auVar249._20_4_ = auVar219._20_4_ * 0.0;
    auVar249._28_36_ = auVar236._28_36_;
    auVar249._24_4_ = auVar219._24_4_ * 0.0;
    fVar263 = auVar5._0_4_;
    fVar290 = auVar5._4_4_;
    auVar20._4_4_ = fVar290 * fVar143;
    auVar20._0_4_ = fVar263 * fVar253;
    auVar20._8_4_ = fVar263 * fVar261;
    auVar20._12_4_ = fVar290 * fVar160;
    auVar20._16_4_ = fVar263 * 0.0;
    auVar20._20_4_ = fVar290 * 0.0;
    auVar20._24_4_ = fVar263 * 0.0;
    auVar20._28_4_ = fVar262;
    auVar4 = vfmadd231ps_fma(auVar281._0_32_,auVar103,local_3a0);
    auVar199 = vfmadd231ps_fma(auVar75,auVar103,auVar271._0_32_);
    auVar195 = vfmadd231ps_fma(auVar249._0_32_,auVar103,auVar275);
    auVar98 = vfmadd231ps_fma(auVar20,auVar103,auVar238);
    auVar73._4_4_ = fStack_27c;
    auVar73._0_4_ = local_280;
    auVar73._8_4_ = fStack_278;
    auVar73._12_4_ = fStack_274;
    auVar73._16_4_ = fStack_270;
    auVar73._20_4_ = fStack_26c;
    auVar73._24_4_ = fStack_268;
    auVar73._28_4_ = fStack_264;
    auVar21._4_4_ = fStack_27c * fVar143;
    auVar21._0_4_ = local_280 * fVar253;
    auVar21._8_4_ = fStack_278 * fVar261;
    auVar21._12_4_ = fStack_274 * fVar160;
    auVar21._16_4_ = fStack_270 * 0.0;
    auVar21._20_4_ = fStack_26c * 0.0;
    auVar21._24_4_ = fStack_268 * 0.0;
    auVar21._28_4_ = auVar238._28_4_;
    auVar74._8_8_ = uStack_1d8;
    auVar74._0_8_ = local_1e0;
    auVar74._16_8_ = uStack_1d0;
    auVar74._24_8_ = uStack_1c8;
    auVar260._0_4_ = (float)local_1e0 * fVar253;
    auVar260._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar143;
    auVar260._8_4_ = (float)uStack_1d8 * fVar261;
    auVar260._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar160;
    auVar260._16_4_ = (float)uStack_1d0 * 0.0;
    auVar260._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar260._28_36_ = auVar219._28_36_;
    auVar260._24_4_ = (float)uStack_1c8 * 0.0;
    auVar22._4_4_ = fVar143 * fStack_47c;
    auVar22._0_4_ = fVar253 * local_480;
    auVar22._8_4_ = fVar261 * fStack_478;
    auVar22._12_4_ = fVar160 * fStack_474;
    auVar22._16_4_ = fStack_470 * 0.0;
    auVar22._20_4_ = fStack_46c * 0.0;
    auVar22._24_4_ = fStack_468 * 0.0;
    auVar22._28_4_ = local_3a0._28_4_;
    auVar23._4_4_ = fVar143 * fStack_49c;
    auVar23._0_4_ = fVar253 * local_4a0;
    auVar23._8_4_ = fVar261 * fStack_498;
    auVar23._12_4_ = fVar160 * fStack_494;
    auVar23._16_4_ = fStack_490 * 0.0;
    auVar23._20_4_ = fStack_48c * 0.0;
    auVar23._24_4_ = fStack_488 * 0.0;
    auVar23._28_4_ = 0x3f800000;
    auVar94 = vfmadd231ps_fma(auVar21,auVar103,auVar227._0_32_);
    auVar241 = vfmadd231ps_fma(auVar260._0_32_,auVar103,auVar245);
    auVar149 = vfmadd231ps_fma(auVar22,auVar103,auVar219._0_32_);
    auVar254 = vfmadd231ps_fma(auVar23,auVar103,auVar287);
    auVar24._4_4_ = fVar143 * fStack_29c;
    auVar24._0_4_ = fVar253 * local_2a0;
    auVar24._8_4_ = fVar261 * fStack_298;
    auVar24._12_4_ = fVar160 * fStack_294;
    auVar24._16_4_ = fStack_290 * 0.0;
    auVar24._20_4_ = fStack_28c * 0.0;
    auVar24._24_4_ = fStack_288 * 0.0;
    auVar24._28_4_ = auVar275._28_4_;
    auVar25._4_4_ = fVar143 * local_200._4_4_;
    auVar25._0_4_ = fVar253 * (float)local_200;
    auVar25._8_4_ = fVar261 * (float)uStack_1f8;
    auVar25._12_4_ = fVar160 * uStack_1f8._4_4_;
    auVar25._16_4_ = (float)uStack_1f0 * 0.0;
    auVar25._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_1e8 * 0.0;
    auVar25._28_4_ = auVar219._28_4_;
    auVar219._28_36_ = auVar227._28_36_;
    auVar219._0_28_ =
         ZEXT1628(CONCAT412(auVar94._12_4_ * fVar160,
                            CONCAT48(auVar94._8_4_ * fVar261,
                                     CONCAT44(auVar94._4_4_ * fVar143,auVar94._0_4_ * fVar253))));
    auVar4 = vfmadd231ps_fma(auVar219._0_32_,auVar103,ZEXT1632(auVar4));
    auVar199 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar241._12_4_,
                                                  CONCAT48(fVar261 * auVar241._8_4_,
                                                           CONCAT44(fVar143 * auVar241._4_4_,
                                                                    fVar253 * auVar241._0_4_)))),
                               auVar103,ZEXT1632(auVar199));
    auVar195 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar149._12_4_,
                                                  CONCAT48(fVar261 * auVar149._8_4_,
                                                           CONCAT44(fVar143 * auVar149._4_4_,
                                                                    fVar253 * auVar149._0_4_)))),
                               auVar103,ZEXT1632(auVar195));
    auVar26._28_4_ = auVar245._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * auVar254._12_4_,
                            CONCAT48(fVar261 * auVar254._8_4_,
                                     CONCAT44(fVar143 * auVar254._4_4_,fVar253 * auVar254._0_4_))));
    auVar98 = vfmadd231ps_fma(auVar26,auVar103,ZEXT1632(auVar98));
    auVar229._0_4_ = fVar253 * (float)local_220;
    auVar229._4_4_ = fVar143 * local_220._4_4_;
    auVar229._8_4_ = fVar261 * (float)uStack_218;
    auVar229._12_4_ = fVar160 * uStack_218._4_4_;
    auVar229._16_4_ = (float)uStack_210 * 0.0;
    auVar229._20_4_ = uStack_210._4_4_ * 0.0;
    auVar229._24_4_ = (float)uStack_208 * 0.0;
    auVar229._28_4_ = 0;
    auVar146 = vfmadd231ps_fma(auVar24,auVar103,auVar73);
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar146._12_4_ * fVar160,
                                                 CONCAT48(auVar146._8_4_ * fVar261,
                                                          CONCAT44(auVar146._4_4_ * fVar143,
                                                                   auVar146._0_4_ * fVar253)))),
                              auVar103,ZEXT1632(auVar94));
    auVar239._0_4_ = fVar253 * (float)local_240;
    auVar239._4_4_ = fVar143 * local_240._4_4_;
    auVar239._8_4_ = fVar261 * (float)uStack_238;
    auVar239._12_4_ = fVar160 * uStack_238._4_4_;
    auVar239._16_4_ = (float)uStack_230 * 0.0;
    auVar239._20_4_ = uStack_230._4_4_ * 0.0;
    auVar239._24_4_ = (float)uStack_228 * 0.0;
    auVar239._28_4_ = 0;
    auVar146 = vfmadd231ps_fma(auVar25,auVar103,auVar74);
    auVar70._4_4_ = fStack_47c;
    auVar70._0_4_ = local_480;
    auVar70._8_4_ = fStack_478;
    auVar70._12_4_ = fStack_474;
    auVar70._16_4_ = fStack_470;
    auVar70._20_4_ = fStack_46c;
    auVar70._24_4_ = fStack_468;
    auVar70._28_4_ = fStack_464;
    auVar90 = vfmadd231ps_fma(auVar229,auVar103,auVar70);
    auVar69._4_4_ = fStack_49c;
    auVar69._0_4_ = local_4a0;
    auVar69._8_4_ = fStack_498;
    auVar69._12_4_ = fStack_494;
    auVar69._16_4_ = fStack_490;
    auVar69._20_4_ = fStack_48c;
    auVar69._24_4_ = fStack_488;
    auVar69._28_4_ = fStack_484;
    auVar91 = vfmadd231ps_fma(auVar239,auVar103,auVar69);
    auVar27._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar91._12_4_ * fVar160,
                            CONCAT48(auVar91._8_4_ * fVar261,
                                     CONCAT44(auVar91._4_4_ * fVar143,auVar91._0_4_ * fVar253))));
    auVar241 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar146._12_4_ * fVar160,
                                                  CONCAT48(auVar146._8_4_ * fVar261,
                                                           CONCAT44(auVar146._4_4_ * fVar143,
                                                                    auVar146._0_4_ * fVar253)))),
                               auVar103,ZEXT1632(auVar241));
    auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar160 * auVar90._12_4_,
                                                  CONCAT48(fVar261 * auVar90._8_4_,
                                                           CONCAT44(fVar143 * auVar90._4_4_,
                                                                    fVar253 * auVar90._0_4_)))),
                               auVar103,ZEXT1632(auVar149));
    auVar254 = vfmadd231ps_fma(auVar27,auVar103,ZEXT1632(auVar254));
    auVar76._28_4_ = fVar290;
    auVar76._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * auVar149._12_4_,
                            CONCAT48(fVar261 * auVar149._8_4_,
                                     CONCAT44(fVar143 * auVar149._4_4_,fVar253 * auVar149._0_4_))));
    auVar28._28_4_ = fStack_264;
    auVar28._0_28_ =
         ZEXT1628(CONCAT412(auVar254._12_4_ * fVar160,
                            CONCAT48(auVar254._8_4_ * fVar261,
                                     CONCAT44(auVar254._4_4_ * fVar143,auVar254._0_4_ * fVar253))));
    auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar160,
                                                  CONCAT48(auVar94._8_4_ * fVar261,
                                                           CONCAT44(auVar94._4_4_ * fVar143,
                                                                    auVar94._0_4_ * fVar253)))),
                               auVar103,ZEXT1632(auVar4));
    auVar90 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar241._12_4_ * fVar160,
                                                 CONCAT48(auVar241._8_4_ * fVar261,
                                                          CONCAT44(auVar241._4_4_ * fVar143,
                                                                   auVar241._0_4_ * fVar253)))),
                              auVar103,ZEXT1632(auVar199));
    auVar91 = vfmadd231ps_fma(auVar76,auVar103,ZEXT1632(auVar195));
    auVar116 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar98),auVar103);
    auVar15 = vsubps_avx(ZEXT1632(auVar94),ZEXT1632(auVar4));
    auVar132 = vsubps_avx(ZEXT1632(auVar241),ZEXT1632(auVar199));
    auVar103 = vsubps_avx(ZEXT1632(auVar149),ZEXT1632(auVar195));
    auVar14 = vsubps_avx(ZEXT1632(auVar254),ZEXT1632(auVar98));
    local_9c0._0_4_ = fVar165 * auVar15._0_4_ * 3.0;
    local_9c0._4_4_ = fVar165 * auVar15._4_4_ * 3.0;
    local_9c0._8_4_ = fVar165 * auVar15._8_4_ * 3.0;
    local_9c0._12_4_ = fVar165 * auVar15._12_4_ * 3.0;
    local_9c0._16_4_ = fVar165 * auVar15._16_4_ * 3.0;
    local_9c0._20_4_ = fVar165 * auVar15._20_4_ * 3.0;
    local_9c0._24_4_ = fVar165 * auVar15._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    local_6e0._0_4_ = fVar165 * auVar132._0_4_ * 3.0;
    local_6e0._4_4_ = fVar165 * auVar132._4_4_ * 3.0;
    local_6e0._8_4_ = fVar165 * auVar132._8_4_ * 3.0;
    local_6e0._12_4_ = fVar165 * auVar132._12_4_ * 3.0;
    local_6e0._16_4_ = fVar165 * auVar132._16_4_ * 3.0;
    local_6e0._20_4_ = fVar165 * auVar132._20_4_ * 3.0;
    local_6e0._24_4_ = fVar165 * auVar132._24_4_ * 3.0;
    local_6e0._28_4_ = 0;
    fVar114 = fVar165 * auVar103._0_4_ * 3.0;
    fVar137 = fVar165 * auVar103._4_4_ * 3.0;
    local_9e0._4_4_ = fVar137;
    local_9e0._0_4_ = fVar114;
    fVar138 = fVar165 * auVar103._8_4_ * 3.0;
    local_9e0._8_4_ = fVar138;
    fVar139 = fVar165 * auVar103._12_4_ * 3.0;
    local_9e0._12_4_ = fVar139;
    fVar140 = fVar165 * auVar103._16_4_ * 3.0;
    local_9e0._16_4_ = fVar140;
    fVar141 = fVar165 * auVar103._20_4_ * 3.0;
    local_9e0._20_4_ = fVar141;
    fVar142 = fVar165 * auVar103._24_4_ * 3.0;
    local_9e0._24_4_ = fVar142;
    local_9e0._28_4_ = auVar15._28_4_;
    fVar143 = fVar165 * auVar14._0_4_ * 3.0;
    fVar160 = fVar165 * auVar14._4_4_ * 3.0;
    auVar29._4_4_ = fVar160;
    auVar29._0_4_ = fVar143;
    fVar161 = fVar165 * auVar14._8_4_ * 3.0;
    auVar29._8_4_ = fVar161;
    fVar162 = fVar165 * auVar14._12_4_ * 3.0;
    auVar29._12_4_ = fVar162;
    fVar163 = fVar165 * auVar14._16_4_ * 3.0;
    auVar29._16_4_ = fVar163;
    fVar164 = fVar165 * auVar14._20_4_ * 3.0;
    auVar29._20_4_ = fVar164;
    fVar165 = fVar165 * auVar14._24_4_ * 3.0;
    auVar29._24_4_ = fVar165;
    auVar29._28_4_ = auVar132._28_4_;
    auVar129 = ZEXT1632(auVar146);
    auVar17 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar146));
    auVar18 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar90));
    _local_800 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar91));
    local_2e0 = vsubps_avx(auVar17,auVar129);
    local_2c0 = vsubps_avx(_local_800,ZEXT1632(auVar91));
    fVar253 = local_2c0._0_4_;
    fVar261 = local_2c0._4_4_;
    auVar30._4_4_ = local_9c0._4_4_ * fVar261;
    auVar30._0_4_ = local_9c0._0_4_ * fVar253;
    fVar262 = local_2c0._8_4_;
    auVar30._8_4_ = local_9c0._8_4_ * fVar262;
    fVar263 = local_2c0._12_4_;
    auVar30._12_4_ = local_9c0._12_4_ * fVar263;
    fVar264 = local_2c0._16_4_;
    auVar30._16_4_ = local_9c0._16_4_ * fVar264;
    fVar265 = local_2c0._20_4_;
    auVar30._20_4_ = local_9c0._20_4_ * fVar265;
    fVar266 = local_2c0._24_4_;
    auVar30._24_4_ = local_9c0._24_4_ * fVar266;
    auVar30._28_4_ = auVar17._28_4_;
    auVar4 = vfmsub231ps_fma(auVar30,local_9e0,local_2e0);
    local_300 = vsubps_avx(auVar18,ZEXT1632(auVar90));
    fVar273 = local_2e0._0_4_;
    fVar274 = local_2e0._4_4_;
    auVar31._4_4_ = fVar274 * local_6e0._4_4_;
    auVar31._0_4_ = fVar273 * local_6e0._0_4_;
    fVar282 = local_2e0._8_4_;
    auVar31._8_4_ = fVar282 * local_6e0._8_4_;
    fVar283 = local_2e0._12_4_;
    auVar31._12_4_ = fVar283 * local_6e0._12_4_;
    fVar284 = local_2e0._16_4_;
    auVar31._16_4_ = fVar284 * local_6e0._16_4_;
    fVar285 = local_2e0._20_4_;
    auVar31._20_4_ = fVar285 * local_6e0._20_4_;
    fVar286 = local_2e0._24_4_;
    auVar31._24_4_ = fVar286 * local_6e0._24_4_;
    auVar31._28_4_ = auVar18._28_4_;
    auVar199 = vfmsub231ps_fma(auVar31,local_9c0,local_300);
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar199._12_4_ * auVar199._12_4_,
                                                CONCAT48(auVar199._8_4_ * auVar199._8_4_,
                                                         CONCAT44(auVar199._4_4_ * auVar199._4_4_,
                                                                  auVar199._0_4_ * auVar199._0_4_)))
                                     ),ZEXT1632(auVar4),ZEXT1632(auVar4));
    fVar189 = local_300._0_4_;
    auVar183._0_4_ = fVar189 * fVar114;
    fVar190 = local_300._4_4_;
    auVar183._4_4_ = fVar190 * fVar137;
    fVar191 = local_300._8_4_;
    auVar183._8_4_ = fVar191 * fVar138;
    fVar192 = local_300._12_4_;
    auVar183._12_4_ = fVar192 * fVar139;
    fVar267 = local_300._16_4_;
    auVar183._16_4_ = fVar267 * fVar140;
    fVar268 = local_300._20_4_;
    auVar183._20_4_ = fVar268 * fVar141;
    fVar272 = local_300._24_4_;
    auVar183._24_4_ = fVar272 * fVar142;
    auVar183._28_4_ = 0;
    auVar199 = vfmsub231ps_fma(auVar183,local_6e0,local_2c0);
    auVar199 = vfmadd231ps_fma(ZEXT1632(auVar4),ZEXT1632(auVar199),ZEXT1632(auVar199));
    auVar184._0_4_ = fVar253 * fVar253;
    auVar184._4_4_ = fVar261 * fVar261;
    auVar184._8_4_ = fVar262 * fVar262;
    auVar184._12_4_ = fVar263 * fVar263;
    auVar184._16_4_ = fVar264 * fVar264;
    auVar184._20_4_ = fVar265 * fVar265;
    auVar184._24_4_ = fVar266 * fVar266;
    auVar184._28_4_ = 0;
    auVar4 = vfmadd231ps_fma(auVar184,local_300,local_300);
    auVar195 = vfmadd231ps_fma(ZEXT1632(auVar4),local_2e0,local_2e0);
    auVar103 = vrcpps_avx(ZEXT1632(auVar195));
    auVar276._8_4_ = 0x3f800000;
    auVar276._0_8_ = 0x3f8000003f800000;
    auVar276._12_4_ = 0x3f800000;
    auVar276._16_4_ = 0x3f800000;
    auVar276._20_4_ = 0x3f800000;
    auVar276._24_4_ = 0x3f800000;
    auVar276._28_4_ = 0x3f800000;
    auVar4 = vfnmadd213ps_fma(auVar103,ZEXT1632(auVar195),auVar276);
    auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar103,auVar103);
    local_860 = vpermps_avx2(_DAT_01fb7720,local_9c0);
    local_880 = vpermps_avx2(_DAT_01fb7720,local_9e0);
    auVar32._4_4_ = local_860._4_4_ * fVar261;
    auVar32._0_4_ = local_860._0_4_ * fVar253;
    auVar32._8_4_ = local_860._8_4_ * fVar262;
    auVar32._12_4_ = local_860._12_4_ * fVar263;
    auVar32._16_4_ = local_860._16_4_ * fVar264;
    auVar32._20_4_ = local_860._20_4_ * fVar265;
    auVar32._24_4_ = local_860._24_4_ * fVar266;
    auVar32._28_4_ = auVar103._28_4_;
    auVar98 = vfmsub231ps_fma(auVar32,local_880,local_2e0);
    local_a00 = vpermps_avx2(_DAT_01fb7720,local_6e0);
    auVar33._4_4_ = fVar274 * local_a00._4_4_;
    auVar33._0_4_ = fVar273 * local_a00._0_4_;
    auVar33._8_4_ = fVar282 * local_a00._8_4_;
    auVar33._12_4_ = fVar283 * local_a00._12_4_;
    auVar33._16_4_ = fVar284 * local_a00._16_4_;
    auVar33._20_4_ = fVar285 * local_a00._20_4_;
    auVar33._24_4_ = fVar286 * local_a00._24_4_;
    auVar33._28_4_ = 0;
    auVar94 = vfmsub231ps_fma(auVar33,local_860,local_300);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * auVar94._12_4_,
                                                 CONCAT48(auVar94._8_4_ * auVar94._8_4_,
                                                          CONCAT44(auVar94._4_4_ * auVar94._4_4_,
                                                                   auVar94._0_4_ * auVar94._0_4_))))
                              ,ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar216._0_4_ = fVar189 * local_880._0_4_;
    auVar216._4_4_ = fVar190 * local_880._4_4_;
    auVar216._8_4_ = fVar191 * local_880._8_4_;
    auVar216._12_4_ = fVar192 * local_880._12_4_;
    auVar216._16_4_ = fVar267 * local_880._16_4_;
    auVar216._20_4_ = fVar268 * local_880._20_4_;
    auVar216._24_4_ = fVar272 * local_880._24_4_;
    auVar216._28_4_ = 0;
    auVar94 = vfmsub231ps_fma(auVar216,local_a00,local_2c0);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar94),ZEXT1632(auVar94));
    auVar103 = vmaxps_avx(ZEXT1632(CONCAT412(auVar4._12_4_ * auVar199._12_4_,
                                             CONCAT48(auVar4._8_4_ * auVar199._8_4_,
                                                      CONCAT44(auVar4._4_4_ * auVar199._4_4_,
                                                               auVar4._0_4_ * auVar199._0_4_)))),
                          ZEXT1632(CONCAT412(auVar98._12_4_ * auVar4._12_4_,
                                             CONCAT48(auVar98._8_4_ * auVar4._8_4_,
                                                      CONCAT44(auVar98._4_4_ * auVar4._4_4_,
                                                               auVar98._0_4_ * auVar4._0_4_)))));
    local_740._0_4_ = auVar116._0_4_ + fVar143;
    local_740._4_4_ = auVar116._4_4_ + fVar160;
    local_740._8_4_ = auVar116._8_4_ + fVar161;
    local_740._12_4_ = auVar116._12_4_ + fVar162;
    local_740._16_4_ = fVar163 + 0.0;
    local_740._20_4_ = fVar164 + 0.0;
    local_740._24_4_ = fVar165 + 0.0;
    local_740._28_4_ = auVar132._28_4_ + 0.0;
    local_720 = ZEXT1632(auVar116);
    auVar132 = vsubps_avx(local_720,auVar29);
    local_760 = vpermps_avx2(_DAT_01fb7720,auVar132);
    auVar101 = vpermps_avx2(_DAT_01fb7720,local_720);
    auVar132 = vmaxps_avx(local_720,local_740);
    auVar14 = vmaxps_avx(local_760,auVar101);
    auVar132 = vmaxps_avx(auVar132,auVar14);
    auVar14 = vrsqrtps_avx(ZEXT1632(auVar195));
    fVar143 = auVar14._0_4_;
    fVar160 = auVar14._4_4_;
    fVar165 = auVar14._8_4_;
    fVar161 = auVar14._12_4_;
    fVar162 = auVar14._16_4_;
    fVar163 = auVar14._20_4_;
    fVar164 = auVar14._24_4_;
    auVar246._0_4_ = fVar143 * fVar143 * fVar143 * auVar195._0_4_ * -0.5;
    auVar246._4_4_ = fVar160 * fVar160 * fVar160 * auVar195._4_4_ * -0.5;
    auVar246._8_4_ = fVar165 * fVar165 * fVar165 * auVar195._8_4_ * -0.5;
    auVar246._12_4_ = fVar161 * fVar161 * fVar161 * auVar195._12_4_ * -0.5;
    auVar246._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
    auVar246._20_4_ = fVar163 * fVar163 * fVar163 * -0.0;
    auVar246._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
    auVar246._28_4_ = 0;
    auVar185._8_4_ = 0x3fc00000;
    auVar185._0_8_ = 0x3fc000003fc00000;
    auVar185._12_4_ = 0x3fc00000;
    auVar185._16_4_ = 0x3fc00000;
    auVar185._20_4_ = 0x3fc00000;
    auVar185._24_4_ = 0x3fc00000;
    auVar185._28_4_ = 0x3fc00000;
    auVar4 = vfmadd231ps_fma(auVar246,auVar185,auVar14);
    fVar143 = auVar4._0_4_;
    fVar160 = auVar4._4_4_;
    auVar34._4_4_ = fVar190 * fVar160;
    auVar34._0_4_ = fVar189 * fVar143;
    fVar165 = auVar4._8_4_;
    auVar34._8_4_ = fVar191 * fVar165;
    fVar161 = auVar4._12_4_;
    auVar34._12_4_ = fVar192 * fVar161;
    auVar34._16_4_ = fVar267 * 0.0;
    auVar34._20_4_ = fVar268 * 0.0;
    auVar34._24_4_ = fVar272 * 0.0;
    auVar34._28_4_ = auVar14._28_4_;
    auVar35._4_4_ = fStack_5bc * fVar160 * fVar261;
    auVar35._0_4_ = local_5c0 * fVar143 * fVar253;
    auVar35._8_4_ = fStack_5b8 * fVar165 * fVar262;
    auVar35._12_4_ = fStack_5b4 * fVar161 * fVar263;
    auVar35._16_4_ = fStack_5b0 * fVar264 * 0.0;
    auVar35._20_4_ = fStack_5ac * fVar265 * 0.0;
    auVar35._24_4_ = fStack_5a8 * fVar266 * 0.0;
    auVar35._28_4_ = local_300._28_4_;
    auVar199 = vfmadd231ps_fma(auVar35,auVar34,_local_580);
    auVar181 = ZEXT1632(auVar91);
    auVar154 = vsubps_avx(ZEXT832(0) << 0x20,auVar181);
    fVar162 = auVar154._0_4_;
    auVar250._0_4_ = fVar162 * fVar143 * fVar253;
    fVar163 = auVar154._4_4_;
    auVar250._4_4_ = fVar163 * fVar160 * fVar261;
    fVar164 = auVar154._8_4_;
    auVar250._8_4_ = fVar164 * fVar165 * fVar262;
    fVar189 = auVar154._12_4_;
    auVar250._12_4_ = fVar189 * fVar161 * fVar263;
    fVar190 = auVar154._16_4_;
    auVar250._16_4_ = fVar190 * fVar264 * 0.0;
    fVar191 = auVar154._20_4_;
    auVar250._20_4_ = fVar191 * fVar265 * 0.0;
    fVar192 = auVar154._24_4_;
    auVar250._24_4_ = fVar192 * fVar266 * 0.0;
    auVar250._28_4_ = 0;
    auVar151 = ZEXT1632(auVar90);
    auVar206 = vsubps_avx(ZEXT832(0) << 0x20,auVar151);
    auVar195 = vfmadd231ps_fma(auVar250,auVar206,auVar34);
    auVar36._4_4_ = fVar274 * fVar160;
    auVar36._0_4_ = fVar273 * fVar143;
    auVar36._8_4_ = fVar282 * fVar165;
    auVar36._12_4_ = fVar283 * fVar161;
    auVar36._16_4_ = fVar284 * 0.0;
    auVar36._20_4_ = fVar285 * 0.0;
    auVar36._24_4_ = fVar286 * 0.0;
    auVar36._28_4_ = local_760._28_4_;
    auVar199 = vfmadd231ps_fma(ZEXT1632(auVar199),auVar36,_local_5a0);
    auVar130 = ZEXT832(0) << 0x20;
    auVar105 = vsubps_avx(auVar130,auVar129);
    auVar195 = vfmadd231ps_fma(ZEXT1632(auVar195),auVar105,auVar36);
    auVar14 = vsqrtps_avx(auVar103);
    auVar37._4_4_ = fStack_5bc * fVar163;
    auVar37._0_4_ = local_5c0 * fVar162;
    auVar37._8_4_ = fStack_5b8 * fVar164;
    auVar37._12_4_ = fStack_5b4 * fVar189;
    auVar37._16_4_ = fStack_5b0 * fVar190;
    auVar37._20_4_ = fStack_5ac * fVar191;
    auVar37._24_4_ = fStack_5a8 * fVar192;
    auVar37._28_4_ = local_760._28_4_;
    auVar98 = vfmadd231ps_fma(auVar37,_local_580,auVar206);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),_local_5a0,auVar105);
    fVar253 = auVar195._0_4_;
    fVar268 = auVar199._0_4_;
    fVar261 = auVar195._4_4_;
    fVar272 = auVar199._4_4_;
    fVar262 = auVar195._8_4_;
    fVar273 = auVar199._8_4_;
    fVar263 = auVar195._12_4_;
    fVar274 = auVar199._12_4_;
    auVar38._28_4_ = auVar103._28_4_;
    auVar38._0_28_ =
         ZEXT1628(CONCAT412(fVar274 * fVar263,
                            CONCAT48(fVar273 * fVar262,CONCAT44(fVar272 * fVar261,fVar268 * fVar253)
                                    )));
    auVar13 = vsubps_avx(ZEXT1632(auVar98),auVar38);
    auVar39._4_4_ = fVar163 * fVar163;
    auVar39._0_4_ = fVar162 * fVar162;
    auVar39._8_4_ = fVar164 * fVar164;
    auVar39._12_4_ = fVar189 * fVar189;
    auVar39._16_4_ = fVar190 * fVar190;
    auVar39._20_4_ = fVar191 * fVar191;
    auVar39._24_4_ = fVar192 * fVar192;
    auVar39._28_4_ = auVar103._28_4_;
    auVar98 = vfmadd231ps_fma(auVar39,auVar206,auVar206);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar105,auVar105);
    auVar102 = vsubps_avx(ZEXT1632(auVar98),
                          ZEXT1632(CONCAT412(fVar263 * fVar263,
                                             CONCAT48(fVar262 * fVar262,
                                                      CONCAT44(fVar261 * fVar261,fVar253 * fVar253))
                                            )));
    fVar267 = auVar14._28_4_ + auVar132._28_4_;
    fVar253 = (auVar14._0_4_ + auVar132._0_4_) * 1.0000002;
    fVar261 = (auVar14._4_4_ + auVar132._4_4_) * 1.0000002;
    fVar262 = (auVar14._8_4_ + auVar132._8_4_) * 1.0000002;
    fVar263 = (auVar14._12_4_ + auVar132._12_4_) * 1.0000002;
    fVar264 = (auVar14._16_4_ + auVar132._16_4_) * 1.0000002;
    fVar265 = (auVar14._20_4_ + auVar132._20_4_) * 1.0000002;
    fVar266 = (auVar14._24_4_ + auVar132._24_4_) * 1.0000002;
    auVar40._4_4_ = fVar261 * fVar261;
    auVar40._0_4_ = fVar253 * fVar253;
    auVar40._8_4_ = fVar262 * fVar262;
    auVar40._12_4_ = fVar263 * fVar263;
    auVar40._16_4_ = fVar264 * fVar264;
    auVar40._20_4_ = fVar265 * fVar265;
    auVar40._24_4_ = fVar266 * fVar266;
    auVar40._28_4_ = fVar267;
    local_420._0_4_ = auVar13._0_4_ + auVar13._0_4_;
    local_420._4_4_ = auVar13._4_4_ + auVar13._4_4_;
    local_420._8_4_ = auVar13._8_4_ + auVar13._8_4_;
    local_420._12_4_ = auVar13._12_4_ + auVar13._12_4_;
    local_420._16_4_ = auVar13._16_4_ + auVar13._16_4_;
    local_420._20_4_ = auVar13._20_4_ + auVar13._20_4_;
    local_420._24_4_ = auVar13._24_4_ + auVar13._24_4_;
    local_420._28_4_ = auVar13._28_4_ + auVar13._28_4_;
    auVar13 = vsubps_avx(auVar102,auVar40);
    local_360 = ZEXT1632(auVar199);
    auVar41._28_4_ = fVar267;
    auVar41._0_28_ =
         ZEXT1628(CONCAT412(fVar274 * fVar274,
                            CONCAT48(fVar273 * fVar273,CONCAT44(fVar272 * fVar272,fVar268 * fVar268)
                                    )));
    auVar152 = vsubps_avx(local_260,auVar41);
    auVar42._4_4_ = local_420._4_4_ * local_420._4_4_;
    auVar42._0_4_ = local_420._0_4_ * local_420._0_4_;
    auVar42._8_4_ = local_420._8_4_ * local_420._8_4_;
    auVar42._12_4_ = local_420._12_4_ * local_420._12_4_;
    auVar42._16_4_ = local_420._16_4_ * local_420._16_4_;
    auVar42._20_4_ = local_420._20_4_ * local_420._20_4_;
    auVar42._24_4_ = local_420._24_4_ * local_420._24_4_;
    auVar42._28_4_ = local_260._28_4_;
    fVar253 = auVar152._0_4_;
    fVar261 = auVar152._4_4_;
    fVar262 = auVar152._8_4_;
    fVar263 = auVar152._12_4_;
    fVar264 = auVar152._16_4_;
    fVar265 = auVar152._20_4_;
    fVar266 = auVar152._24_4_;
    auVar43._4_4_ = fVar261 * 4.0 * auVar13._4_4_;
    auVar43._0_4_ = fVar253 * 4.0 * auVar13._0_4_;
    auVar43._8_4_ = fVar262 * 4.0 * auVar13._8_4_;
    auVar43._12_4_ = fVar263 * 4.0 * auVar13._12_4_;
    auVar43._16_4_ = fVar264 * 4.0 * auVar13._16_4_;
    auVar43._20_4_ = fVar265 * 4.0 * auVar13._20_4_;
    auVar43._24_4_ = fVar266 * 4.0 * auVar13._24_4_;
    auVar43._28_4_ = 0x40800000;
    auVar16 = vsubps_avx(auVar42,auVar43);
    auVar132 = vcmpps_avx(auVar16,auVar130,5);
    auVar103 = vandps_avx(auVar41,local_6a0);
    local_340._0_4_ = fVar253 + fVar253;
    local_340._4_4_ = fVar261 + fVar261;
    local_340._8_4_ = fVar262 + fVar262;
    local_340._12_4_ = fVar263 + fVar263;
    local_340._16_4_ = fVar264 + fVar264;
    local_340._20_4_ = fVar265 + fVar265;
    local_340._24_4_ = fVar266 + fVar266;
    local_340._28_4_ = auVar152._28_4_ + auVar152._28_4_;
    local_320 = vandps_avx(auVar152,local_6a0);
    if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0x7f,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar132 >> 0xbf,0) == '\0') &&
        (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar132[0x1f])
    {
      local_ac0._8_4_ = 0x7f800000;
      local_ac0._0_8_ = 0x7f8000007f800000;
      local_ac0._12_4_ = 0x7f800000;
      local_ac0._16_4_ = 0x7f800000;
      local_ac0._20_4_ = 0x7f800000;
      local_ac0._24_4_ = 0x7f800000;
      local_ac0._28_4_ = 0x7f800000;
      auVar277._8_4_ = 0xff800000;
      auVar277._0_8_ = 0xff800000ff800000;
      auVar277._12_4_ = 0xff800000;
      auVar277._16_4_ = 0xff800000;
      auVar277._20_4_ = 0xff800000;
      auVar277._24_4_ = 0xff800000;
      auVar277._28_4_ = 0xff800000;
    }
    else {
      auVar203 = vsqrtps_avx(auVar16);
      auVar202 = vrcpps_avx(local_340);
      auVar152 = vcmpps_avx(auVar16,auVar130,5);
      auVar230._8_4_ = 0x3f800000;
      auVar230._0_8_ = 0x3f8000003f800000;
      auVar230._12_4_ = 0x3f800000;
      auVar230._16_4_ = 0x3f800000;
      auVar230._20_4_ = 0x3f800000;
      auVar230._24_4_ = 0x3f800000;
      auVar230._28_4_ = 0x3f800000;
      auVar199 = vfnmadd213ps_fma(auVar202,local_340,auVar230);
      auVar199 = vfmadd132ps_fma(ZEXT1632(auVar199),auVar202,auVar202);
      uVar80 = CONCAT44(local_420._4_4_,local_420._0_4_);
      auVar278._0_8_ = uVar80 ^ 0x8000000080000000;
      auVar278._8_4_ = -local_420._8_4_;
      auVar278._12_4_ = -local_420._12_4_;
      auVar278._16_4_ = -local_420._16_4_;
      auVar278._20_4_ = -local_420._20_4_;
      auVar278._24_4_ = -local_420._24_4_;
      auVar278._28_4_ = -local_420._28_4_;
      auVar16 = vsubps_avx(auVar278,auVar203);
      auVar44._4_4_ = auVar16._4_4_ * auVar199._4_4_;
      auVar44._0_4_ = auVar16._0_4_ * auVar199._0_4_;
      auVar44._8_4_ = auVar16._8_4_ * auVar199._8_4_;
      auVar44._12_4_ = auVar16._12_4_ * auVar199._12_4_;
      auVar44._16_4_ = auVar16._16_4_ * 0.0;
      auVar44._20_4_ = auVar16._20_4_ * 0.0;
      auVar44._24_4_ = auVar16._24_4_ * 0.0;
      auVar44._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar203,local_420);
      auVar45._4_4_ = auVar199._4_4_ * auVar16._4_4_;
      auVar45._0_4_ = auVar199._0_4_ * auVar16._0_4_;
      auVar45._8_4_ = auVar199._8_4_ * auVar16._8_4_;
      auVar45._12_4_ = auVar199._12_4_ * auVar16._12_4_;
      auVar45._16_4_ = auVar16._16_4_ * 0.0;
      auVar45._20_4_ = auVar16._20_4_ * 0.0;
      auVar45._24_4_ = auVar16._24_4_ * 0.0;
      auVar45._28_4_ = auVar16._28_4_;
      auVar199 = vfmadd213ps_fma(local_360,auVar44,ZEXT1632(auVar195));
      local_400 = fVar143 * auVar199._0_4_;
      fStack_3fc = fVar160 * auVar199._4_4_;
      fStack_3f8 = fVar165 * auVar199._8_4_;
      fStack_3f4 = fVar161 * auVar199._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0x80000000;
      auVar199 = vfmadd213ps_fma(local_360,auVar45,ZEXT1632(auVar195));
      local_3e0 = fVar143 * auVar199._0_4_;
      fStack_3dc = fVar160 * auVar199._4_4_;
      fStack_3d8 = fVar165 * auVar199._8_4_;
      fStack_3d4 = fVar161 * auVar199._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x80000000;
      auVar231._8_4_ = 0x7f800000;
      auVar231._0_8_ = 0x7f8000007f800000;
      auVar231._12_4_ = 0x7f800000;
      auVar231._16_4_ = 0x7f800000;
      auVar231._20_4_ = 0x7f800000;
      auVar231._24_4_ = 0x7f800000;
      auVar231._28_4_ = 0x7f800000;
      local_ac0 = vblendvps_avx(auVar231,auVar44,auVar152);
      auVar232._8_4_ = 0xff800000;
      auVar232._0_8_ = 0xff800000ff800000;
      auVar232._12_4_ = 0xff800000;
      auVar232._16_4_ = 0xff800000;
      auVar232._20_4_ = 0xff800000;
      auVar232._24_4_ = 0xff800000;
      auVar232._28_4_ = 0xff800000;
      auVar277 = vblendvps_avx(auVar232,auVar45,auVar152);
      auVar16 = vmaxps_avx(local_4c0,auVar103);
      auVar46._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar46._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar46._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar46._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar46._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar46._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar46._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar46._28_4_ = auVar16._28_4_;
      auVar16 = vcmpps_avx(local_320,auVar46,1);
      auVar130 = auVar152 & auVar16;
      if ((((((((auVar130 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar130 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar130 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar130 >> 0x7f,0) != '\0') ||
            (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar130 >> 0xbf,0) != '\0') ||
          (auVar130 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar130[0x1f] < '\0') {
        auVar132 = vandps_avx(auVar16,auVar152);
        auVar16 = vcmpps_avx(auVar13,_DAT_01f7b000,2);
        auVar235._8_4_ = 0xff800000;
        auVar235._0_8_ = 0xff800000ff800000;
        auVar235._12_4_ = 0xff800000;
        auVar235._16_4_ = 0xff800000;
        auVar235._20_4_ = 0xff800000;
        auVar235._24_4_ = 0xff800000;
        auVar235._28_4_ = 0xff800000;
        auVar288._8_4_ = 0x7f800000;
        auVar288._0_8_ = 0x7f8000007f800000;
        auVar288._12_4_ = 0x7f800000;
        auVar288._16_4_ = 0x7f800000;
        auVar288._20_4_ = 0x7f800000;
        auVar288._24_4_ = 0x7f800000;
        auVar288._28_4_ = 0x7f800000;
        auVar13 = vblendvps_avx(auVar288,auVar235,auVar16);
        auVar199 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
        auVar130 = vpmovsxwd_avx2(auVar199);
        local_ac0 = vblendvps_avx(local_ac0,auVar13,auVar130);
        auVar13 = vblendvps_avx(auVar235,auVar288,auVar16);
        auVar277 = vblendvps_avx(auVar277,auVar13,auVar130);
        auVar226._0_8_ = auVar132._0_8_ ^ 0xffffffffffffffff;
        auVar226._8_4_ = auVar132._8_4_ ^ 0xffffffff;
        auVar226._12_4_ = auVar132._12_4_ ^ 0xffffffff;
        auVar226._16_4_ = auVar132._16_4_ ^ 0xffffffff;
        auVar226._20_4_ = auVar132._20_4_ ^ 0xffffffff;
        auVar226._24_4_ = auVar132._24_4_ ^ 0xffffffff;
        auVar226._28_4_ = auVar132._28_4_ ^ 0xffffffff;
        auVar132 = vorps_avx(auVar16,auVar226);
        auVar132 = vandps_avx(auVar152,auVar132);
      }
    }
    local_960 = ZEXT1632(auVar195);
    auVar260 = ZEXT3264(local_a20);
    auVar227 = ZEXT3264(local_a40);
    auVar219 = ZEXT3264(local_aa0);
    auVar236 = ZEXT3264(local_380);
    auVar13 = local_380 & auVar132;
    auVar245 = local_8e0;
    auVar275 = local_8c0;
    if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar13 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar13 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar13 >> 0x7f,0) == '\0') &&
          (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar13 >> 0xbf,0) == '\0') &&
        (auVar13 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar13[0x1f]) {
      auVar271 = ZEXT3264(local_8a0);
    }
    else {
      local_440 = ZEXT1632(auVar4);
      fVar267 = (ray->org).field_0.m128[3] - (float)local_7e0._0_4_;
      auVar217._4_4_ = fVar267;
      auVar217._0_4_ = fVar267;
      auVar217._8_4_ = fVar267;
      auVar217._12_4_ = fVar267;
      auVar217._16_4_ = fVar267;
      auVar217._20_4_ = fVar267;
      auVar217._24_4_ = fVar267;
      auVar217._28_4_ = fVar267;
      auVar13 = vmaxps_avx(auVar217,local_ac0);
      fVar267 = ray->tfar - (float)local_7e0._0_4_;
      auVar223._4_4_ = fVar267;
      auVar223._0_4_ = fVar267;
      auVar223._8_4_ = fVar267;
      auVar223._12_4_ = fVar267;
      auVar223._16_4_ = fVar267;
      auVar223._20_4_ = fVar267;
      auVar223._24_4_ = fVar267;
      auVar223._28_4_ = fVar267;
      auVar152 = vminps_avx(auVar223,auVar277);
      auVar47._4_4_ = fVar163 * fVar137;
      auVar47._0_4_ = fVar162 * fVar114;
      auVar47._8_4_ = fVar164 * fVar138;
      auVar47._12_4_ = fVar189 * fVar139;
      auVar47._16_4_ = fVar190 * fVar140;
      auVar47._20_4_ = fVar191 * fVar141;
      auVar47._24_4_ = fVar192 * fVar142;
      auVar47._28_4_ = auVar154._28_4_;
      auVar4 = vfmadd213ps_fma(auVar206,local_6e0,auVar47);
      auVar199 = vfmadd213ps_fma(auVar105,local_9c0,ZEXT1632(auVar4));
      auVar48._4_4_ = fStack_5bc * fVar137;
      auVar48._0_4_ = local_5c0 * fVar114;
      auVar48._8_4_ = fStack_5b8 * fVar138;
      auVar48._12_4_ = fStack_5b4 * fVar139;
      auVar48._16_4_ = fStack_5b0 * fVar140;
      auVar48._20_4_ = fStack_5ac * fVar141;
      auVar48._24_4_ = fStack_5a8 * fVar142;
      auVar48._28_4_ = auVar15._28_4_;
      auVar4 = vfmadd231ps_fma(auVar48,_local_580,local_6e0);
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5a0,local_9c0);
      auVar15 = vandps_avx(local_6a0,ZEXT1632(auVar195));
      auVar279._8_4_ = 0x219392ef;
      auVar279._0_8_ = 0x219392ef219392ef;
      auVar279._12_4_ = 0x219392ef;
      auVar279._16_4_ = 0x219392ef;
      auVar279._20_4_ = 0x219392ef;
      auVar279._24_4_ = 0x219392ef;
      auVar279._28_4_ = 0x219392ef;
      auVar154 = vcmpps_avx(auVar15,auVar279,1);
      auVar15 = vrcpps_avx(ZEXT1632(auVar195));
      auVar256._8_4_ = 0x3f800000;
      auVar256._0_8_ = 0x3f8000003f800000;
      auVar256._12_4_ = 0x3f800000;
      auVar256._16_4_ = 0x3f800000;
      auVar256._20_4_ = 0x3f800000;
      auVar256._24_4_ = 0x3f800000;
      auVar256._28_4_ = 0x3f800000;
      auVar105 = ZEXT1632(auVar195);
      auVar4 = vfnmadd213ps_fma(auVar15,auVar105,auVar256);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar15,auVar15);
      auVar257._0_8_ = auVar195._0_8_ ^ 0x8000000080000000;
      auVar257._8_4_ = auVar195._8_4_ ^ 0x80000000;
      auVar257._12_4_ = auVar195._12_4_ ^ 0x80000000;
      auVar257._16_4_ = 0x80000000;
      auVar257._20_4_ = 0x80000000;
      auVar257._24_4_ = 0x80000000;
      auVar257._28_4_ = 0x80000000;
      auVar49._4_4_ = auVar4._4_4_ * -auVar199._4_4_;
      auVar49._0_4_ = auVar4._0_4_ * -auVar199._0_4_;
      auVar49._8_4_ = auVar4._8_4_ * -auVar199._8_4_;
      auVar49._12_4_ = auVar4._12_4_ * -auVar199._12_4_;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar15 = vcmpps_avx(auVar105,auVar257,1);
      auVar15 = vorps_avx(auVar154,auVar15);
      auVar280._8_4_ = 0xff800000;
      auVar280._0_8_ = 0xff800000ff800000;
      auVar280._12_4_ = 0xff800000;
      auVar280._16_4_ = 0xff800000;
      auVar280._20_4_ = 0xff800000;
      auVar280._24_4_ = 0xff800000;
      auVar280._28_4_ = 0xff800000;
      auVar15 = vblendvps_avx(auVar49,auVar280,auVar15);
      auVar206 = vmaxps_avx(auVar13,auVar15);
      auVar15 = vcmpps_avx(auVar105,auVar257,6);
      auVar15 = vorps_avx(auVar154,auVar15);
      auVar258._8_4_ = 0x7f800000;
      auVar258._0_8_ = 0x7f8000007f800000;
      auVar258._12_4_ = 0x7f800000;
      auVar258._16_4_ = 0x7f800000;
      auVar258._20_4_ = 0x7f800000;
      auVar258._24_4_ = 0x7f800000;
      auVar258._28_4_ = 0x7f800000;
      auVar15 = vblendvps_avx(auVar49,auVar258,auVar15);
      auVar105 = vminps_avx(auVar152,auVar15);
      fVar114 = -local_880._0_4_;
      fVar137 = -local_880._4_4_;
      fVar138 = -local_880._8_4_;
      fVar139 = -local_880._12_4_;
      fVar140 = -local_880._16_4_;
      fVar141 = -local_880._20_4_;
      fVar142 = -local_880._24_4_;
      auVar186._0_8_ = local_a00._0_8_ ^ 0x8000000080000000;
      auVar186._8_4_ = -local_a00._8_4_;
      auVar186._12_4_ = -local_a00._12_4_;
      auVar186._16_4_ = -local_a00._16_4_;
      auVar186._20_4_ = -local_a00._20_4_;
      auVar186._24_4_ = -local_a00._24_4_;
      auVar186._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar18);
      auVar154 = vsubps_avx(ZEXT832(0) << 0x20,_local_800);
      auVar50._4_4_ = auVar154._4_4_ * fVar137;
      auVar50._0_4_ = auVar154._0_4_ * fVar114;
      auVar50._8_4_ = auVar154._8_4_ * fVar138;
      auVar50._12_4_ = auVar154._12_4_ * fVar139;
      auVar50._16_4_ = auVar154._16_4_ * fVar140;
      auVar50._20_4_ = auVar154._20_4_ * fVar141;
      auVar50._24_4_ = auVar154._24_4_ * fVar142;
      auVar50._28_4_ = auVar154._28_4_;
      auVar4 = vfmadd231ps_fma(auVar50,auVar186,auVar15);
      auVar204._0_8_ = local_860._0_8_ ^ 0x8000000080000000;
      auVar204._8_4_ = -local_860._8_4_;
      auVar204._12_4_ = -local_860._12_4_;
      auVar204._16_4_ = -local_860._16_4_;
      auVar204._20_4_ = -local_860._20_4_;
      auVar204._24_4_ = -local_860._24_4_;
      auVar204._28_4_ = local_860._28_4_ ^ 0x80000000;
      auVar15 = vsubps_avx(ZEXT832(0) << 0x20,auVar17);
      auVar199 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar204,auVar15);
      auVar51._4_4_ = fStack_5bc * fVar137;
      auVar51._0_4_ = local_5c0 * fVar114;
      auVar51._8_4_ = fStack_5b8 * fVar138;
      auVar51._12_4_ = fStack_5b4 * fVar139;
      auVar51._16_4_ = fStack_5b0 * fVar140;
      auVar51._20_4_ = fStack_5ac * fVar141;
      auVar51._24_4_ = fStack_5a8 * fVar142;
      auVar51._28_4_ = local_880._28_4_ ^ 0x80000000;
      auVar4 = vfmadd231ps_fma(auVar51,_local_580,auVar186);
      auVar195 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_5a0,auVar204);
      auVar15 = vandps_avx(local_6a0,ZEXT1632(auVar195));
      auVar13 = vrcpps_avx(ZEXT1632(auVar195));
      auVar224._8_4_ = 0x219392ef;
      auVar224._0_8_ = 0x219392ef219392ef;
      auVar224._12_4_ = 0x219392ef;
      auVar224._16_4_ = 0x219392ef;
      auVar224._20_4_ = 0x219392ef;
      auVar224._24_4_ = 0x219392ef;
      auVar224._28_4_ = 0x219392ef;
      auVar154 = vcmpps_avx(auVar15,auVar224,1);
      auVar247._8_4_ = 0x3f800000;
      auVar247._0_8_ = 0x3f8000003f800000;
      auVar247._12_4_ = 0x3f800000;
      auVar247._16_4_ = 0x3f800000;
      auVar247._20_4_ = 0x3f800000;
      auVar247._24_4_ = 0x3f800000;
      auVar247._28_4_ = 0x3f800000;
      auVar152 = ZEXT1632(auVar195);
      auVar4 = vfnmadd213ps_fma(auVar13,auVar152,auVar247);
      auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar13,auVar13);
      auVar205._0_8_ = auVar195._0_8_ ^ 0x8000000080000000;
      auVar205._8_4_ = auVar195._8_4_ ^ 0x80000000;
      auVar205._12_4_ = auVar195._12_4_ ^ 0x80000000;
      auVar205._16_4_ = 0x80000000;
      auVar205._20_4_ = 0x80000000;
      auVar205._24_4_ = 0x80000000;
      auVar205._28_4_ = 0x80000000;
      auVar52._4_4_ = auVar4._4_4_ * -auVar199._4_4_;
      auVar52._0_4_ = auVar4._0_4_ * -auVar199._0_4_;
      auVar52._8_4_ = auVar4._8_4_ * -auVar199._8_4_;
      auVar52._12_4_ = auVar4._12_4_ * -auVar199._12_4_;
      auVar52._16_4_ = 0x80000000;
      auVar52._20_4_ = 0x80000000;
      auVar52._24_4_ = 0x80000000;
      auVar52._28_4_ = 0x80000000;
      auVar15 = vcmpps_avx(auVar152,auVar205,1);
      auVar15 = vorps_avx(auVar154,auVar15);
      auVar15 = vblendvps_avx(auVar52,auVar280,auVar15);
      local_6c0 = vmaxps_avx(auVar206,auVar15);
      auVar15 = vcmpps_avx(auVar152,auVar205,6);
      auVar15 = vorps_avx(auVar154,auVar15);
      auVar15 = vblendvps_avx(auVar52,auVar258,auVar15);
      auVar132 = vandps_avx(auVar132,local_380);
      local_520 = vminps_avx(auVar105,auVar15);
      auVar15 = vcmpps_avx(local_6c0,local_520,2);
      auVar154 = auVar132 & auVar15;
      if ((((((((auVar154 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar154 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar154 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar154 >> 0x7f,0) != '\0') ||
            (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar154 >> 0xbf,0) != '\0') ||
          (auVar154 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar154[0x1f] < '\0') {
        uStack_838 = 0x80000000;
        local_840 = 0x8000000080000000;
        uStack_834 = 0x80000000;
        uStack_830 = 0x80000000;
        uStack_82c = 0x80000000;
        uStack_828 = 0x80000000;
        uStack_824 = 0x80000000;
        auVar71._4_4_ = fStack_3fc;
        auVar71._0_4_ = local_400;
        auVar71._8_4_ = fStack_3f8;
        auVar71._12_4_ = fStack_3f4;
        auVar71._16_4_ = uStack_3f0;
        auVar71._20_4_ = uStack_3ec;
        auVar71._24_4_ = uStack_3e8;
        auVar71._28_4_ = uStack_3e4;
        auVar225._8_4_ = 0x3f800000;
        auVar225._0_8_ = 0x3f8000003f800000;
        auVar225._12_4_ = 0x3f800000;
        auVar225._16_4_ = 0x3f800000;
        auVar225._20_4_ = 0x3f800000;
        auVar225._24_4_ = 0x3f800000;
        auVar225._28_4_ = 0x3f800000;
        auVar154 = vminps_avx(auVar71,auVar225);
        auVar67 = ZEXT812(0);
        auVar105 = ZEXT1232(auVar67) << 0x20;
        auVar154 = vmaxps_avx(auVar154,ZEXT1232(auVar67) << 0x20);
        auVar72._4_4_ = fStack_3dc;
        auVar72._0_4_ = local_3e0;
        auVar72._8_4_ = fStack_3d8;
        auVar72._12_4_ = fStack_3d4;
        auVar72._16_4_ = uStack_3d0;
        auVar72._20_4_ = uStack_3cc;
        auVar72._24_4_ = uStack_3c8;
        auVar72._28_4_ = uStack_3c4;
        auVar206 = vminps_avx(auVar72,auVar225);
        auVar206 = vmaxps_avx(auVar206,ZEXT1232(auVar67) << 0x20);
        auVar53._4_4_ = (auVar154._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar154._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar154._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar154._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar154._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar154._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar154._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar154._28_4_ + 7.0;
        auVar4 = vfmadd213ps_fma(auVar53,local_700,local_900);
        auVar54._4_4_ = (auVar206._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar206._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar206._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar206._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar206._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar206._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar206._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar206._28_4_ + 7.0;
        auVar199 = vfmadd213ps_fma(auVar54,local_700,local_900);
        auVar154 = vminps_avx(local_720,local_740);
        auVar206 = vminps_avx(local_760,auVar101);
        auVar154 = vminps_avx(auVar154,auVar206);
        auVar14 = vsubps_avx(auVar154,auVar14);
        auVar132 = vandps_avx(auVar15,auVar132);
        local_1a0 = ZEXT1632(auVar4);
        local_1c0 = ZEXT1632(auVar199);
        auVar55._4_4_ = auVar14._4_4_ * 0.99999976;
        auVar55._0_4_ = auVar14._0_4_ * 0.99999976;
        auVar55._8_4_ = auVar14._8_4_ * 0.99999976;
        auVar55._12_4_ = auVar14._12_4_ * 0.99999976;
        auVar55._16_4_ = auVar14._16_4_ * 0.99999976;
        auVar55._20_4_ = auVar14._20_4_ * 0.99999976;
        auVar55._24_4_ = auVar14._24_4_ * 0.99999976;
        auVar55._28_4_ = 0x3f7ffffc;
        auVar14 = vmaxps_avx(ZEXT832(0) << 0x20,auVar55);
        auVar56._4_4_ = auVar14._4_4_ * auVar14._4_4_;
        auVar56._0_4_ = auVar14._0_4_ * auVar14._0_4_;
        auVar56._8_4_ = auVar14._8_4_ * auVar14._8_4_;
        auVar56._12_4_ = auVar14._12_4_ * auVar14._12_4_;
        auVar56._16_4_ = auVar14._16_4_ * auVar14._16_4_;
        auVar56._20_4_ = auVar14._20_4_ * auVar14._20_4_;
        auVar56._24_4_ = auVar14._24_4_ * auVar14._24_4_;
        auVar56._28_4_ = auVar14._28_4_;
        auVar15 = vsubps_avx(auVar102,auVar56);
        auVar57._4_4_ = auVar15._4_4_ * fVar261 * 4.0;
        auVar57._0_4_ = auVar15._0_4_ * fVar253 * 4.0;
        auVar57._8_4_ = auVar15._8_4_ * fVar262 * 4.0;
        auVar57._12_4_ = auVar15._12_4_ * fVar263 * 4.0;
        auVar57._16_4_ = auVar15._16_4_ * fVar264 * 4.0;
        auVar57._20_4_ = auVar15._20_4_ * fVar265 * 4.0;
        auVar57._24_4_ = auVar15._24_4_ * fVar266 * 4.0;
        auVar57._28_4_ = auVar14._28_4_;
        auVar14 = vsubps_avx(auVar42,auVar57);
        local_940 = vcmpps_avx(auVar14,ZEXT1232(auVar67) << 0x20,5);
        if ((((((((local_940 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_940 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_940 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_940 >> 0x7f,0) == '\0') &&
              (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_940 >> 0xbf,0) == '\0') &&
            (local_940 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_940[0x1f]) {
          auVar102 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar215 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar154 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar206 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar243 = ZEXT828(0) << 0x20;
          auVar233._8_4_ = 0x7f800000;
          auVar233._0_8_ = 0x7f8000007f800000;
          auVar233._12_4_ = 0x7f800000;
          auVar233._16_4_ = 0x7f800000;
          auVar233._20_4_ = 0x7f800000;
          auVar233._24_4_ = 0x7f800000;
          auVar233._28_4_ = 0x7f800000;
          auVar251._8_4_ = 0xff800000;
          auVar251._0_8_ = 0xff800000ff800000;
          auVar251._12_4_ = 0xff800000;
          auVar251._16_4_ = 0xff800000;
          auVar251._20_4_ = 0xff800000;
          auVar251._24_4_ = 0xff800000;
          auVar251._28_4_ = 0xff800000;
        }
        else {
          auVar154 = vrcpps_avx(local_340);
          auVar187._8_4_ = 0x3f800000;
          auVar187._0_8_ = 0x3f8000003f800000;
          auVar187._12_4_ = 0x3f800000;
          auVar187._16_4_ = 0x3f800000;
          auVar187._20_4_ = 0x3f800000;
          auVar187._24_4_ = 0x3f800000;
          auVar187._28_4_ = 0x3f800000;
          auVar4 = vfnmadd213ps_fma(local_340,auVar154,auVar187);
          auVar105 = vsqrtps_avx(auVar14);
          auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar154,auVar154);
          uVar80 = CONCAT44(local_420._4_4_,local_420._0_4_);
          auVar153._0_8_ = uVar80 ^ 0x8000000080000000;
          auVar153._8_4_ = -local_420._8_4_;
          auVar153._12_4_ = -local_420._12_4_;
          auVar153._16_4_ = -local_420._16_4_;
          auVar153._20_4_ = -local_420._20_4_;
          auVar153._24_4_ = -local_420._24_4_;
          auVar153._28_4_ = -local_420._28_4_;
          auVar154 = vsubps_avx(auVar153,auVar105);
          auVar105 = vsubps_avx(auVar105,local_420);
          fVar114 = auVar154._0_4_ * auVar4._0_4_;
          fVar137 = auVar154._4_4_ * auVar4._4_4_;
          auVar58._4_4_ = fVar137;
          auVar58._0_4_ = fVar114;
          fVar138 = auVar154._8_4_ * auVar4._8_4_;
          auVar58._8_4_ = fVar138;
          fVar139 = auVar154._12_4_ * auVar4._12_4_;
          auVar58._12_4_ = fVar139;
          fVar140 = auVar154._16_4_ * 0.0;
          auVar58._16_4_ = fVar140;
          fVar141 = auVar154._20_4_ * 0.0;
          auVar58._20_4_ = fVar141;
          fVar142 = auVar154._24_4_ * 0.0;
          auVar58._24_4_ = fVar142;
          auVar58._28_4_ = fVar290;
          fVar253 = auVar105._0_4_ * auVar4._0_4_;
          fVar261 = auVar105._4_4_ * auVar4._4_4_;
          auVar59._4_4_ = fVar261;
          auVar59._0_4_ = fVar253;
          fVar262 = auVar105._8_4_ * auVar4._8_4_;
          auVar59._8_4_ = fVar262;
          fVar263 = auVar105._12_4_ * auVar4._12_4_;
          auVar59._12_4_ = fVar263;
          fVar264 = auVar105._16_4_ * 0.0;
          auVar59._16_4_ = fVar264;
          fVar265 = auVar105._20_4_ * 0.0;
          auVar59._20_4_ = fVar265;
          fVar266 = auVar105._24_4_ * 0.0;
          auVar59._24_4_ = fVar266;
          auVar59._28_4_ = auVar206._28_4_;
          auVar4 = vfmadd213ps_fma(local_360,auVar58,local_960);
          auVar199 = vfmadd213ps_fma(local_360,auVar59,local_960);
          auVar154 = ZEXT1632(CONCAT412(fVar161 * auVar4._12_4_,
                                        CONCAT48(fVar165 * auVar4._8_4_,
                                                 CONCAT44(fVar160 * auVar4._4_4_,
                                                          fVar143 * auVar4._0_4_))));
          auVar206 = ZEXT1632(CONCAT412(fVar161 * auVar199._12_4_,
                                        CONCAT48(fVar165 * auVar199._8_4_,
                                                 CONCAT44(fVar160 * auVar199._4_4_,
                                                          fVar143 * auVar199._0_4_))));
          auVar4 = vfmadd213ps_fma(local_2e0,auVar154,auVar129);
          auVar199 = vfmadd213ps_fma(local_2e0,auVar206,auVar129);
          auVar195 = vfmadd213ps_fma(local_300,auVar154,auVar151);
          auVar98 = vfmadd213ps_fma(local_300,auVar206,auVar151);
          auVar94 = vfmadd213ps_fma(auVar154,local_2c0,auVar181);
          auVar241 = vfmadd213ps_fma(local_2c0,auVar206,auVar181);
          auVar60._4_4_ = fVar137 * (float)local_5a0._4_4_;
          auVar60._0_4_ = fVar114 * (float)local_5a0._0_4_;
          auVar60._8_4_ = fVar138 * fStack_598;
          auVar60._12_4_ = fVar139 * fStack_594;
          auVar60._16_4_ = fVar140 * fStack_590;
          auVar60._20_4_ = fVar141 * fStack_58c;
          auVar60._24_4_ = fVar142 * fStack_588;
          auVar60._28_4_ = 0;
          auVar154 = vsubps_avx(auVar60,ZEXT1632(auVar4));
          auVar207._0_4_ = fVar114 * (float)local_580._0_4_;
          auVar207._4_4_ = fVar137 * (float)local_580._4_4_;
          auVar207._8_4_ = fVar138 * fStack_578;
          auVar207._12_4_ = fVar139 * fStack_574;
          auVar207._16_4_ = fVar140 * fStack_570;
          auVar207._20_4_ = fVar141 * fStack_56c;
          auVar207._24_4_ = fVar142 * fStack_568;
          auVar207._28_4_ = 0;
          auVar206 = vsubps_avx(auVar207,ZEXT1632(auVar195));
          auVar218._0_4_ = local_5c0 * fVar114;
          auVar218._4_4_ = fStack_5bc * fVar137;
          auVar218._8_4_ = fStack_5b8 * fVar138;
          auVar218._12_4_ = fStack_5b4 * fVar139;
          auVar218._16_4_ = fStack_5b0 * fVar140;
          auVar218._20_4_ = fStack_5ac * fVar141;
          auVar218._24_4_ = fStack_5a8 * fVar142;
          auVar218._28_4_ = 0;
          auVar13 = vsubps_avx(auVar218,ZEXT1632(auVar94));
          auVar61._4_4_ = fVar261 * (float)local_5a0._4_4_;
          auVar61._0_4_ = fVar253 * (float)local_5a0._0_4_;
          auVar61._8_4_ = fVar262 * fStack_598;
          auVar61._12_4_ = fVar263 * fStack_594;
          auVar61._16_4_ = fVar264 * fStack_590;
          auVar61._20_4_ = fVar265 * fStack_58c;
          auVar61._24_4_ = fVar266 * fStack_588;
          auVar61._28_4_ = auVar13._28_4_;
          auVar105 = vsubps_avx(auVar61,ZEXT1632(auVar199));
          auVar62._4_4_ = fVar261 * (float)local_580._4_4_;
          auVar62._0_4_ = fVar253 * (float)local_580._0_4_;
          auVar62._8_4_ = fVar262 * fStack_578;
          auVar62._12_4_ = fVar263 * fStack_574;
          auVar62._16_4_ = fVar264 * fStack_570;
          auVar62._20_4_ = fVar265 * fStack_56c;
          auVar62._24_4_ = fVar266 * fStack_568;
          auVar62._28_4_ = 0;
          auVar102 = vsubps_avx(auVar62,ZEXT1632(auVar98));
          auVar63._4_4_ = fStack_5bc * fVar261;
          auVar63._0_4_ = local_5c0 * fVar253;
          auVar63._8_4_ = fStack_5b8 * fVar262;
          auVar63._12_4_ = fStack_5b4 * fVar263;
          auVar63._16_4_ = fStack_5b0 * fVar264;
          auVar63._20_4_ = fStack_5ac * fVar265;
          auVar63._24_4_ = fStack_5a8 * fVar266;
          auVar63._28_4_ = 0;
          auVar152 = vsubps_avx(auVar63,ZEXT1632(auVar241));
          auVar215 = auVar152._0_28_;
          auVar14 = vcmpps_avx(auVar14,_DAT_01f7b000,5);
          auVar234._8_4_ = 0x7f800000;
          auVar234._0_8_ = 0x7f8000007f800000;
          auVar234._12_4_ = 0x7f800000;
          auVar234._16_4_ = 0x7f800000;
          auVar234._20_4_ = 0x7f800000;
          auVar234._24_4_ = 0x7f800000;
          auVar234._28_4_ = 0x7f800000;
          auVar233 = vblendvps_avx(auVar234,auVar58,auVar14);
          auVar103 = vmaxps_avx(local_4c0,auVar103);
          auVar64._4_4_ = auVar103._4_4_ * 1.9073486e-06;
          auVar64._0_4_ = auVar103._0_4_ * 1.9073486e-06;
          auVar64._8_4_ = auVar103._8_4_ * 1.9073486e-06;
          auVar64._12_4_ = auVar103._12_4_ * 1.9073486e-06;
          auVar64._16_4_ = auVar103._16_4_ * 1.9073486e-06;
          auVar64._20_4_ = auVar103._20_4_ * 1.9073486e-06;
          auVar64._24_4_ = auVar103._24_4_ * 1.9073486e-06;
          auVar64._28_4_ = auVar103._28_4_;
          auVar103 = vcmpps_avx(local_320,auVar64,1);
          auVar252._8_4_ = 0xff800000;
          auVar252._0_8_ = 0xff800000ff800000;
          auVar252._12_4_ = 0xff800000;
          auVar252._16_4_ = 0xff800000;
          auVar252._20_4_ = 0xff800000;
          auVar252._24_4_ = 0xff800000;
          auVar252._28_4_ = 0xff800000;
          auVar251 = vblendvps_avx(auVar252,auVar59,auVar14);
          auVar152 = auVar14 & auVar103;
          if ((((((((auVar152 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar152 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar152 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar152 >> 0x7f,0) != '\0') ||
                (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar152 >> 0xbf,0) != '\0') ||
              (auVar152 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar152[0x1f] < '\0') {
            auVar103 = vandps_avx(auVar103,auVar14);
            auVar152 = vcmpps_avx(auVar15,_DAT_01f7b000,2);
            auVar248._8_4_ = 0xff800000;
            auVar248._0_8_ = 0xff800000ff800000;
            auVar248._12_4_ = 0xff800000;
            auVar248._16_4_ = 0xff800000;
            auVar248._20_4_ = 0xff800000;
            auVar248._24_4_ = 0xff800000;
            auVar248._28_4_ = 0xff800000;
            auVar289._8_4_ = 0x7f800000;
            auVar289._0_8_ = 0x7f8000007f800000;
            auVar289._12_4_ = 0x7f800000;
            auVar289._16_4_ = 0x7f800000;
            auVar289._20_4_ = 0x7f800000;
            auVar289._24_4_ = 0x7f800000;
            auVar289._28_4_ = 0x7f800000;
            auVar15 = vblendvps_avx(auVar289,auVar248,auVar152);
            auVar4 = vpackssdw_avx(auVar103._0_16_,auVar103._16_16_);
            auVar16 = vpmovsxwd_avx2(auVar4);
            auVar233 = vblendvps_avx(auVar233,auVar15,auVar16);
            auVar15 = vblendvps_avx(auVar248,auVar289,auVar152);
            auVar251 = vblendvps_avx(auVar251,auVar15,auVar16);
            auVar240._0_8_ = auVar103._0_8_ ^ 0xffffffffffffffff;
            auVar240._8_4_ = auVar103._8_4_ ^ 0xffffffff;
            auVar240._12_4_ = auVar103._12_4_ ^ 0xffffffff;
            auVar240._16_4_ = auVar103._16_4_ ^ 0xffffffff;
            auVar240._20_4_ = auVar103._20_4_ ^ 0xffffffff;
            auVar240._24_4_ = auVar103._24_4_ ^ 0xffffffff;
            auVar240._28_4_ = auVar103._28_4_ ^ 0xffffffff;
            auVar103 = vorps_avx(auVar152,auVar240);
            local_940 = vandps_avx(auVar14,auVar103);
          }
          auVar243 = auVar13._0_28_;
        }
        uVar89 = *(undefined4 *)&(ray->dir).field_0;
        auVar259._4_4_ = uVar89;
        auVar259._0_4_ = uVar89;
        auVar259._8_4_ = uVar89;
        auVar259._12_4_ = uVar89;
        auVar259._16_4_ = uVar89;
        auVar259._20_4_ = uVar89;
        auVar259._24_4_ = uVar89;
        auVar259._28_4_ = uVar89;
        uVar89 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar270._4_4_ = uVar89;
        auVar270._0_4_ = uVar89;
        auVar270._8_4_ = uVar89;
        auVar270._12_4_ = uVar89;
        auVar270._16_4_ = uVar89;
        auVar270._20_4_ = uVar89;
        auVar270._24_4_ = uVar89;
        auVar270._28_4_ = uVar89;
        fVar253 = (ray->dir).field_0.m128[2];
        local_500 = local_6c0;
        local_4e0 = vminps_avx(local_520,auVar233);
        _local_780 = vmaxps_avx(local_6c0,auVar251);
        _local_540 = _local_780;
        auVar103 = vcmpps_avx(local_6c0,local_4e0,2);
        local_5e0 = vandps_avx(auVar103,auVar132);
        auVar236 = ZEXT3264(local_5e0);
        auVar103 = vcmpps_avx(_local_780,local_520,2);
        local_7c0 = vandps_avx(auVar103,auVar132);
        auVar103 = vorps_avx(local_7c0,local_5e0);
        if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar103 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar103 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar103 >> 0x7f,0) != '\0') ||
              (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar103 >> 0xbf,0) != '\0') ||
            (auVar103 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar103[0x1f] < '\0') {
          auVar65._4_4_ = fVar253 * auVar215._4_4_;
          auVar65._0_4_ = fVar253 * auVar215._0_4_;
          auVar65._8_4_ = fVar253 * auVar215._8_4_;
          auVar65._12_4_ = fVar253 * auVar215._12_4_;
          auVar65._16_4_ = fVar253 * auVar215._16_4_;
          auVar65._20_4_ = fVar253 * auVar215._20_4_;
          auVar65._24_4_ = fVar253 * auVar215._24_4_;
          auVar65._28_4_ = auVar103._28_4_;
          auVar4 = vfmadd213ps_fma(auVar102,auVar270,auVar65);
          auVar66._4_4_ = auVar243._4_4_ * fVar253;
          auVar66._0_4_ = auVar243._0_4_ * fVar253;
          auVar66._8_4_ = auVar243._8_4_ * fVar253;
          auVar66._12_4_ = auVar243._12_4_ * fVar253;
          auVar66._16_4_ = auVar243._16_4_ * fVar253;
          auVar66._20_4_ = auVar243._20_4_ * fVar253;
          auVar66._24_4_ = auVar243._24_4_ * fVar253;
          auVar66._28_4_ = auVar103._28_4_;
          auVar199 = vfmadd213ps_fma(auVar206,auVar270,auVar66);
          auVar4 = vfmadd213ps_fma(auVar105,auVar259,ZEXT1632(auVar4));
          auVar109._0_8_ = local_940._0_8_ ^ 0xffffffffffffffff;
          auVar109._8_4_ = local_940._8_4_ ^ 0xffffffff;
          auVar109._12_4_ = local_940._12_4_ ^ 0xffffffff;
          auVar109._16_4_ = local_940._16_4_ ^ 0xffffffff;
          auVar109._20_4_ = local_940._20_4_ ^ 0xffffffff;
          auVar109._24_4_ = local_940._24_4_ ^ 0xffffffff;
          auVar109._28_4_ = local_940._28_4_ ^ 0xffffffff;
          auVar103 = vandps_avx(ZEXT1632(auVar4),local_6a0);
          auVar155._8_4_ = 0x3e99999a;
          auVar155._0_8_ = 0x3e99999a3e99999a;
          auVar155._12_4_ = 0x3e99999a;
          auVar155._16_4_ = 0x3e99999a;
          auVar155._20_4_ = 0x3e99999a;
          auVar155._24_4_ = 0x3e99999a;
          auVar155._28_4_ = 0x3e99999a;
          auVar103 = vcmpps_avx(auVar103,auVar155,1);
          local_620 = vorps_avx(auVar103,auVar109);
          auVar4 = vfmadd213ps_fma(auVar154,auVar259,ZEXT1632(auVar199));
          auVar103 = vandps_avx(ZEXT1632(auVar4),local_6a0);
          auVar103 = vcmpps_avx(auVar103,auVar155,1);
          auVar103 = vorps_avx(auVar103,auVar109);
          auVar134._8_4_ = 3;
          auVar134._0_8_ = 0x300000003;
          auVar134._12_4_ = 3;
          auVar134._16_4_ = 3;
          auVar134._20_4_ = 3;
          auVar134._24_4_ = 3;
          auVar134._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar103 = vblendvps_avx(auVar156,auVar134,auVar103);
          local_640._4_4_ = local_b84;
          local_640._0_4_ = local_b84;
          local_640._8_4_ = local_b84;
          local_640._12_4_ = local_b84;
          local_640._16_4_ = local_b84;
          local_640._20_4_ = local_b84;
          local_640._24_4_ = local_b84;
          local_640._28_4_ = local_b84;
          local_600 = vpcmpgtd_avx2(auVar103,local_640);
          auVar103 = vpandn_avx2(local_600,local_5e0);
          local_7a0._4_4_ = local_6c0._4_4_ + (float)local_680._4_4_;
          local_7a0._0_4_ = local_6c0._0_4_ + (float)local_680._0_4_;
          fStack_798 = local_6c0._8_4_ + fStack_678;
          fStack_794 = local_6c0._12_4_ + fStack_674;
          fStack_790 = local_6c0._16_4_ + fStack_670;
          fStack_78c = local_6c0._20_4_ + fStack_66c;
          fStack_788 = local_6c0._24_4_ + fStack_668;
          fStack_784 = local_6c0._28_4_ + fStack_664;
          while( true ) {
            local_460 = auVar103;
            if ((((((((auVar103 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar103 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar103 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar103 >> 0x7f,0) == '\0') &&
                  (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar103 >> 0xbf,0) == '\0') &&
                (auVar103 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar103[0x1f]) break;
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar132 = vblendvps_avx(auVar135,local_6c0,auVar103);
            auVar14 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar14 = vminps_avx(auVar132,auVar14);
            auVar15 = vshufpd_avx(auVar14,auVar14,5);
            auVar14 = vminps_avx(auVar14,auVar15);
            auVar15 = vpermpd_avx2(auVar14,0x4e);
            auVar14 = vminps_avx(auVar14,auVar15);
            auVar132 = vcmpps_avx(auVar132,auVar14,0);
            auVar14 = auVar103 & auVar132;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar103 = vandps_avx(auVar132,auVar103);
            }
            uVar78 = vmovmskps_avx(auVar103);
            iVar19 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar80 = (ulong)(uint)(iVar19 << 2);
            *(undefined4 *)(local_460 + uVar80) = 0;
            aVar2 = (ray->dir).field_0;
            local_940._0_16_ = (undefined1  [16])aVar2;
            auVar4 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar78 = *(uint *)(local_1a0 + uVar80);
            uVar82 = *(uint *)(local_500 + uVar80);
            if (auVar4._0_4_ < 0.0) {
              fVar253 = sqrtf(auVar4._0_4_);
              uVar80 = extraout_RAX;
            }
            else {
              auVar4 = vsqrtss_avx(auVar4,auVar4);
              fVar253 = auVar4._0_4_;
            }
            auVar236 = ZEXT464(uVar82);
            auVar199 = vminps_avx(local_920._0_16_,local_820._0_16_);
            auVar4 = vmaxps_avx(local_920._0_16_,local_820._0_16_);
            auVar195 = vminps_avx(auVar6,_local_a80);
            auVar98 = vminps_avx(auVar199,auVar195);
            auVar199 = vmaxps_avx(auVar6,_local_a80);
            auVar195 = vmaxps_avx(auVar4,auVar199);
            local_860._8_4_ = 0x7fffffff;
            local_860._0_8_ = 0x7fffffff7fffffff;
            local_860._12_4_ = 0x7fffffff;
            auVar4 = vandps_avx(auVar98,local_860._0_16_);
            auVar199 = vandps_avx(auVar195,local_860._0_16_);
            auVar4 = vmaxps_avx(auVar4,auVar199);
            auVar199 = vmovshdup_avx(auVar4);
            auVar199 = vmaxss_avx(auVar199,auVar4);
            auVar4 = vshufpd_avx(auVar4,auVar4,1);
            auVar4 = vmaxss_avx(auVar4,auVar199);
            local_840._0_4_ = auVar4._0_4_ * 1.9073486e-06;
            local_880._0_4_ = fVar253 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar195,auVar195,0xff);
            auVar4 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar78),0x10);
            uVar84 = 0;
            while( true ) {
              bVar77 = (byte)uVar80;
              if (uVar84 == 5) break;
              local_9c0._0_16_ = vmovshdup_avx(auVar4);
              fVar262 = 1.0 - local_9c0._0_4_;
              auVar199 = vshufps_avx(auVar4,auVar4,0x55);
              fVar253 = auVar199._0_4_;
              auVar117._0_4_ = local_820._0_4_ * fVar253;
              fVar143 = auVar199._4_4_;
              auVar117._4_4_ = local_820._4_4_ * fVar143;
              fVar261 = auVar199._8_4_;
              auVar117._8_4_ = local_820._8_4_ * fVar261;
              fVar160 = auVar199._12_4_;
              auVar117._12_4_ = local_820._12_4_ * fVar160;
              auVar145._4_4_ = fVar262;
              auVar145._0_4_ = fVar262;
              auVar145._8_4_ = fVar262;
              auVar145._12_4_ = fVar262;
              auVar199 = vfmadd231ps_fma(auVar117,auVar145,local_920._0_16_);
              auVar167._0_4_ = fVar88 * fVar253;
              auVar167._4_4_ = auVar6._4_4_ * fVar143;
              auVar167._8_4_ = auVar6._8_4_ * fVar261;
              auVar167._12_4_ = auVar6._12_4_ * fVar160;
              auVar195 = vfmadd231ps_fma(auVar167,auVar145,local_820._0_16_);
              auVar211._0_4_ = fVar253 * auVar195._0_4_;
              auVar211._4_4_ = fVar143 * auVar195._4_4_;
              auVar211._8_4_ = fVar261 * auVar195._8_4_;
              auVar211._12_4_ = fVar160 * auVar195._12_4_;
              auVar98 = vfmadd231ps_fma(auVar211,auVar145,auVar199);
              auVar118._0_4_ = fVar253 * (float)local_a80._0_4_;
              auVar118._4_4_ = fVar143 * (float)local_a80._4_4_;
              auVar118._8_4_ = fVar261 * fStack_a78;
              auVar118._12_4_ = fVar160 * fStack_a74;
              auVar199 = vfmadd231ps_fma(auVar118,auVar145,auVar6);
              auVar194._0_4_ = fVar253 * auVar199._0_4_;
              auVar194._4_4_ = fVar143 * auVar199._4_4_;
              auVar194._8_4_ = fVar261 * auVar199._8_4_;
              auVar194._12_4_ = fVar160 * auVar199._12_4_;
              auVar195 = vfmadd231ps_fma(auVar194,auVar145,auVar195);
              fVar165 = auVar4._0_4_;
              auVar119._4_4_ = fVar165;
              auVar119._0_4_ = fVar165;
              auVar119._8_4_ = fVar165;
              auVar119._12_4_ = fVar165;
              auVar199 = vfmadd213ps_fma(auVar119,local_940._0_16_,_DAT_01f45a50);
              auVar93._0_4_ = fVar253 * auVar195._0_4_;
              auVar93._4_4_ = fVar143 * auVar195._4_4_;
              auVar93._8_4_ = fVar261 * auVar195._8_4_;
              auVar93._12_4_ = fVar160 * auVar195._12_4_;
              auVar94 = vfmadd231ps_fma(auVar93,auVar98,auVar145);
              local_6e0._0_16_ = auVar94;
              auVar199 = vsubps_avx(auVar199,auVar94);
              _local_800 = auVar199;
              auVar199 = vdpps_avx(auVar199,auVar199,0x7f);
              fVar253 = auVar199._0_4_;
              if (fVar253 < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)fVar262);
                local_a00._0_16_ = auVar98;
                local_ac0._0_16_ = auVar195;
                auVar236._0_4_ = sqrtf(fVar253);
                auVar236._4_60_ = extraout_var;
                auVar94 = auVar236._0_16_;
                uVar80 = extraout_RAX_00;
                auVar195 = local_ac0._0_16_;
                auVar98 = local_a00._0_16_;
                auVar241 = local_9e0._0_16_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar199,auVar199);
                auVar241 = ZEXT416((uint)fVar262);
              }
              auVar195 = vsubps_avx(auVar195,auVar98);
              auVar228._0_4_ = auVar195._0_4_ * 3.0;
              auVar228._4_4_ = auVar195._4_4_ * 3.0;
              auVar228._8_4_ = auVar195._8_4_ * 3.0;
              auVar228._12_4_ = auVar195._12_4_ * 3.0;
              auVar195 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar241,local_9c0._0_16_);
              auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0._0_16_,auVar241);
              fVar143 = auVar241._0_4_ * 6.0;
              fVar261 = auVar195._0_4_ * 6.0;
              fVar160 = auVar98._0_4_ * 6.0;
              fVar262 = local_9c0._0_4_ * 6.0;
              auVar168._0_4_ = fVar262 * (float)local_a80._0_4_;
              auVar168._4_4_ = fVar262 * (float)local_a80._4_4_;
              auVar168._8_4_ = fVar262 * fStack_a78;
              auVar168._12_4_ = fVar262 * fStack_a74;
              auVar120._4_4_ = fVar160;
              auVar120._0_4_ = fVar160;
              auVar120._8_4_ = fVar160;
              auVar120._12_4_ = fVar160;
              auVar195 = vfmadd132ps_fma(auVar120,auVar168,auVar6);
              auVar169._4_4_ = fVar261;
              auVar169._0_4_ = fVar261;
              auVar169._8_4_ = fVar261;
              auVar169._12_4_ = fVar261;
              auVar195 = vfmadd132ps_fma(auVar169,auVar195,local_820._0_16_);
              auVar98 = vdpps_avx(auVar228,auVar228,0x7f);
              auVar121._4_4_ = fVar143;
              auVar121._0_4_ = fVar143;
              auVar121._8_4_ = fVar143;
              auVar121._12_4_ = fVar143;
              auVar149 = vfmadd132ps_fma(auVar121,auVar195,local_920._0_16_);
              auVar195 = vblendps_avx(auVar98,_DAT_01f45a50,0xe);
              auVar241 = vrsqrtss_avx(auVar195,auVar195);
              fVar160 = auVar98._0_4_;
              fVar143 = auVar241._0_4_;
              auVar241 = vdpps_avx(auVar228,auVar149,0x7f);
              fVar143 = fVar143 * 1.5 + fVar160 * -0.5 * fVar143 * fVar143 * fVar143;
              auVar122._0_4_ = auVar149._0_4_ * fVar160;
              auVar122._4_4_ = auVar149._4_4_ * fVar160;
              auVar122._8_4_ = auVar149._8_4_ * fVar160;
              auVar122._12_4_ = auVar149._12_4_ * fVar160;
              fVar261 = auVar241._0_4_;
              auVar212._0_4_ = auVar228._0_4_ * fVar261;
              auVar212._4_4_ = auVar228._4_4_ * fVar261;
              auVar212._8_4_ = auVar228._8_4_ * fVar261;
              auVar212._12_4_ = auVar228._12_4_ * fVar261;
              auVar241 = vsubps_avx(auVar122,auVar212);
              auVar195 = vrcpss_avx(auVar195,auVar195);
              auVar149 = vfnmadd213ss_fma(auVar195,auVar98,ZEXT416(0x40000000));
              fVar261 = auVar195._0_4_ * auVar149._0_4_;
              auVar195 = vmaxss_avx(ZEXT416((uint)(float)local_840),
                                    ZEXT416((uint)(fVar165 * (float)local_880._0_4_)));
              auVar260 = ZEXT1664(auVar195);
              uVar68 = CONCAT44(auVar228._4_4_,auVar228._0_4_);
              auVar220._0_8_ = uVar68 ^ 0x8000000080000000;
              auVar220._8_4_ = -auVar228._8_4_;
              auVar220._12_4_ = -auVar228._12_4_;
              auVar170._0_4_ = fVar143 * auVar241._0_4_ * fVar261;
              auVar170._4_4_ = fVar143 * auVar241._4_4_ * fVar261;
              auVar170._8_4_ = fVar143 * auVar241._8_4_ * fVar261;
              auVar170._12_4_ = fVar143 * auVar241._12_4_ * fVar261;
              auVar269._0_4_ = auVar228._0_4_ * fVar143;
              auVar269._4_4_ = auVar228._4_4_ * fVar143;
              auVar269._8_4_ = auVar228._8_4_ * fVar143;
              auVar269._12_4_ = auVar228._12_4_ * fVar143;
              local_9c0._0_16_ = auVar228;
              local_9e0._0_4_ = auVar195._0_4_;
              if (fVar160 < -fVar160) {
                local_a00._0_4_ = auVar94._0_4_;
                local_ac0._0_16_ = auVar220;
                local_960._0_16_ = auVar269;
                local_900._0_16_ = auVar170;
                fVar143 = sqrtf(fVar160);
                auVar94 = ZEXT416((uint)local_a00._0_4_);
                auVar260 = ZEXT464((uint)local_9e0._0_4_);
                uVar80 = extraout_RAX_01;
                auVar170 = local_900._0_16_;
                auVar220 = local_ac0._0_16_;
                auVar269 = local_960._0_16_;
              }
              else {
                auVar195 = vsqrtss_avx(auVar98,auVar98);
                fVar143 = auVar195._0_4_;
              }
              auVar195 = vdpps_avx(_local_800,auVar269,0x7f);
              auVar254 = vfmadd213ss_fma(ZEXT416((uint)(float)local_840),auVar94,auVar260._0_16_);
              auVar98 = vdpps_avx(auVar220,auVar269,0x7f);
              auVar241 = vdpps_avx(_local_800,auVar170,0x7f);
              auVar149 = vdpps_avx(local_940._0_16_,auVar269,0x7f);
              auVar254 = vfmadd213ss_fma(ZEXT416((uint)(auVar94._0_4_ + 1.0)),
                                         ZEXT416((uint)((float)local_840 / fVar143)),auVar254);
              fVar143 = auVar98._0_4_ + auVar241._0_4_;
              auVar95._0_4_ = auVar195._0_4_ * auVar195._0_4_;
              auVar95._4_4_ = auVar195._4_4_ * auVar195._4_4_;
              auVar95._8_4_ = auVar195._8_4_ * auVar195._8_4_;
              auVar95._12_4_ = auVar195._12_4_ * auVar195._12_4_;
              auVar98 = vdpps_avx(_local_800,auVar220,0x7f);
              auVar241 = vsubps_avx(auVar199,auVar95);
              auVar94 = vrsqrtss_avx(auVar241,auVar241);
              fVar160 = auVar241._0_4_;
              fVar261 = auVar94._0_4_;
              fVar261 = fVar261 * 1.5 + fVar160 * -0.5 * fVar261 * fVar261 * fVar261;
              auVar94 = vdpps_avx(_local_800,local_940._0_16_,0x7f);
              auVar98 = vfnmadd231ss_fma(auVar98,auVar195,ZEXT416((uint)fVar143));
              auVar94 = vfnmadd231ss_fma(auVar94,auVar195,auVar149);
              if (fVar160 < 0.0) {
                local_a00._0_16_ = auVar195;
                local_ac0._0_4_ = auVar254._0_4_;
                local_960._0_16_ = ZEXT416((uint)fVar143);
                local_900._0_16_ = auVar149;
                local_700._0_16_ = auVar98;
                local_720._0_4_ = fVar261;
                local_740._0_16_ = auVar94;
                fVar160 = sqrtf(fVar160);
                auVar260 = ZEXT464((uint)local_9e0._0_4_);
                uVar80 = extraout_RAX_02;
                fVar261 = (float)local_720._0_4_;
                auVar94 = local_740._0_16_;
                auVar98 = local_700._0_16_;
                auVar195 = local_a00._0_16_;
                auVar149 = local_900._0_16_;
                auVar241 = local_960._0_16_;
                fVar143 = (float)local_ac0._0_4_;
              }
              else {
                auVar241 = vsqrtss_avx(auVar241,auVar241);
                fVar160 = auVar241._0_4_;
                auVar241 = ZEXT416((uint)fVar143);
                fVar143 = auVar254._0_4_;
              }
              auVar236 = ZEXT1664(local_9c0._0_16_);
              auVar254 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar160 = fVar160 - auVar254._0_4_;
              auVar254 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xff);
              auVar98 = vfmsub213ss_fma(auVar98,ZEXT416((uint)fVar261),auVar254);
              auVar171._0_8_ = auVar149._0_8_ ^ 0x8000000080000000;
              auVar171._8_4_ = auVar149._8_4_ ^ 0x80000000;
              auVar171._12_4_ = auVar149._12_4_ ^ 0x80000000;
              auVar196._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
              auVar196._8_4_ = auVar98._8_4_ ^ 0x80000000;
              auVar196._12_4_ = auVar98._12_4_ ^ 0x80000000;
              auVar146 = ZEXT416((uint)(auVar94._0_4_ * fVar261));
              auVar94 = vfmsub231ss_fma(ZEXT416((uint)(auVar149._0_4_ * auVar98._0_4_)),auVar241,
                                        auVar146);
              auVar98 = vinsertps_avx(auVar196,auVar146,0x1c);
              uVar89 = auVar94._0_4_;
              auVar197._4_4_ = uVar89;
              auVar197._0_4_ = uVar89;
              auVar197._8_4_ = uVar89;
              auVar197._12_4_ = uVar89;
              auVar98 = vdivps_avx(auVar98,auVar197);
              auVar94 = vinsertps_avx(auVar241,auVar171,0x10);
              auVar94 = vdivps_avx(auVar94,auVar197);
              fVar261 = auVar195._0_4_;
              auVar147._0_4_ = fVar261 * auVar98._0_4_ + fVar160 * auVar94._0_4_;
              auVar147._4_4_ = fVar261 * auVar98._4_4_ + fVar160 * auVar94._4_4_;
              auVar147._8_4_ = fVar261 * auVar98._8_4_ + fVar160 * auVar94._8_4_;
              auVar147._12_4_ = fVar261 * auVar98._12_4_ + fVar160 * auVar94._12_4_;
              auVar4 = vsubps_avx(auVar4,auVar147);
              auVar195 = vandps_avx(auVar195,local_860._0_16_);
              if (auVar195._0_4_ < fVar143) {
                auVar98 = vfmadd231ss_fma(ZEXT416((uint)(auVar260._0_4_ + fVar143)),local_760._0_16_
                                          ,ZEXT416(0x36000000));
                auVar195 = vandps_avx(ZEXT416((uint)fVar160),local_860._0_16_);
                if (auVar195._0_4_ < auVar98._0_4_) {
                  bVar87 = uVar84 < 5;
                  fVar143 = auVar4._0_4_ + (float)local_7e0._0_4_;
                  bVar77 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar143) &&
                     (fVar261 = ray->tfar, fVar143 <= fVar261)) {
                    auVar4 = vmovshdup_avx(auVar4);
                    fVar160 = auVar4._0_4_;
                    bVar77 = 0;
                    if ((0.0 <= fVar160) && (bVar77 = 0, fVar160 <= 1.0)) {
                      auVar4 = vrsqrtss_avx(auVar199,auVar199);
                      fVar262 = auVar4._0_4_;
                      pGVar8 = (context->scene->geometries).items[uVar81].ptr;
                      if ((pGVar8->mask & ray->mask) == 0) {
                        bVar77 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar77 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar253 = fVar262 * 1.5 + fVar253 * -0.5 * fVar262 * fVar262 * fVar262;
                        auVar172._0_4_ = fVar253 * (float)local_800._0_4_;
                        auVar172._4_4_ = fVar253 * (float)local_800._4_4_;
                        auVar172._8_4_ = fVar253 * fStack_7f8;
                        auVar172._12_4_ = fVar253 * fStack_7f4;
                        auVar98 = vfmadd213ps_fma(auVar254,auVar172,local_9c0._0_16_);
                        auVar4 = vshufps_avx(auVar172,auVar172,0xc9);
                        auVar199 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                        auVar173._0_4_ = auVar172._0_4_ * auVar199._0_4_;
                        auVar173._4_4_ = auVar172._4_4_ * auVar199._4_4_;
                        auVar173._8_4_ = auVar172._8_4_ * auVar199._8_4_;
                        auVar173._12_4_ = auVar172._12_4_ * auVar199._12_4_;
                        auVar195 = vfmsub231ps_fma(auVar173,local_9c0._0_16_,auVar4);
                        auVar4 = vshufps_avx(auVar195,auVar195,0xc9);
                        auVar199 = vshufps_avx(auVar98,auVar98,0xc9);
                        auVar195 = vshufps_avx(auVar195,auVar195,0xd2);
                        auVar96._0_4_ = auVar98._0_4_ * auVar195._0_4_;
                        auVar96._4_4_ = auVar98._4_4_ * auVar195._4_4_;
                        auVar96._8_4_ = auVar98._8_4_ * auVar195._8_4_;
                        auVar96._12_4_ = auVar98._12_4_ * auVar195._12_4_;
                        auVar199 = vfmsub231ps_fma(auVar96,auVar4,auVar199);
                        auVar4 = vshufps_avx(auVar199,auVar199,0xe9);
                        local_9a0 = vmovlps_avx(auVar4);
                        local_998 = auVar199._0_4_;
                        local_990 = 0;
                        local_98c = (undefined4)local_968;
                        local_984 = context->user->instID[0];
                        local_980 = context->user->instPrimID[0];
                        ray->tfar = fVar143;
                        local_660._0_4_ = 0xffffffff;
                        local_a70.valid = (int *)local_660;
                        local_a70.geometryUserPtr = pGVar8->userPtr;
                        local_a70.context = context->user;
                        local_a70.hit = (RTCHitN *)&local_9a0;
                        local_a70.N = 1;
                        local_a70.ray = (RTCRayN *)ray;
                        local_994 = fVar160;
                        local_988 = uVar81;
                        if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013ca4f9:
                          p_Var12 = context->args->filter;
                          if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar236 = ZEXT1664(auVar236._0_16_);
                            (*p_Var12)(&local_a70);
                            if (*local_a70.valid == 0) goto LAB_013ca541;
                          }
                          bVar77 = 1;
                        }
                        else {
                          auVar236 = ZEXT1664(local_9c0._0_16_);
                          (*pGVar8->occlusionFilterN)(&local_a70);
                          if (*local_a70.valid != 0) goto LAB_013ca4f9;
LAB_013ca541:
                          ray->tfar = fVar261;
                          bVar77 = 0;
                        }
                      }
                    }
                  }
                  goto LAB_013ca303;
                }
              }
              uVar84 = uVar84 + 1;
            }
            bVar87 = false;
LAB_013ca303:
            fVar253 = ray->tfar;
            auVar110._4_4_ = fVar253;
            auVar110._0_4_ = fVar253;
            auVar110._8_4_ = fVar253;
            auVar110._12_4_ = fVar253;
            auVar110._16_4_ = fVar253;
            auVar110._20_4_ = fVar253;
            auVar110._24_4_ = fVar253;
            auVar110._28_4_ = fVar253;
            bVar86 = bVar86 | bVar87 & bVar77;
            auVar103 = vcmpps_avx(_local_7a0,auVar110,2);
            auVar103 = vandps_avx(auVar103,local_460);
          }
          auVar111._0_4_ = local_780._0_4_ + (float)local_680._0_4_;
          auVar111._4_4_ = local_780._4_4_ + (float)local_680._4_4_;
          auVar111._8_4_ = local_780._8_4_ + fStack_678;
          auVar111._12_4_ = local_780._12_4_ + fStack_674;
          auVar111._16_4_ = local_780._16_4_ + fStack_670;
          auVar111._20_4_ = local_780._20_4_ + fStack_66c;
          auVar111._24_4_ = local_780._24_4_ + fStack_668;
          auVar111._28_4_ = local_780._28_4_ + fStack_664;
          fVar143 = ray->tfar;
          fVar253 = ray->tfar;
          auVar157._4_4_ = fVar253;
          auVar157._0_4_ = fVar253;
          auVar157._8_4_ = fVar253;
          auVar157._12_4_ = fVar253;
          auVar157._16_4_ = fVar253;
          auVar157._20_4_ = fVar253;
          auVar157._24_4_ = fVar253;
          auVar157._28_4_ = fVar253;
          auVar103 = vcmpps_avx(auVar111,auVar157,2);
          _local_7a0 = vandps_avx(auVar103,local_7c0);
          auVar112._8_4_ = 3;
          auVar112._0_8_ = 0x300000003;
          auVar112._12_4_ = 3;
          auVar112._16_4_ = 3;
          auVar112._20_4_ = 3;
          auVar112._24_4_ = 3;
          auVar112._28_4_ = 3;
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar103 = vblendvps_avx(auVar158,auVar112,local_620);
          local_7c0 = vpcmpgtd_avx2(auVar103,local_640);
          local_660 = vpandn_avx2(local_7c0,_local_7a0);
          local_6c0 = _local_540;
          local_780._4_4_ = (float)local_680._4_4_ + (float)local_540._4_4_;
          local_780._0_4_ = (float)local_680._0_4_ + (float)local_540._0_4_;
          fStack_778 = fStack_678 + fStack_538;
          fStack_774 = fStack_674 + fStack_534;
          fStack_770 = fStack_670 + fStack_530;
          fStack_76c = fStack_66c + fStack_52c;
          fStack_768 = fStack_668 + fStack_528;
          fStack_764 = fStack_664 + fStack_524;
          auVar271 = ZEXT3264(local_8a0);
          auVar249 = ZEXT3264(local_8c0);
          auVar260 = ZEXT3264(local_a20);
          auVar281 = ZEXT3264(local_8e0);
          auVar219 = ZEXT3264(local_aa0);
          auVar227 = ZEXT3264(local_a40);
          while( true ) {
            auVar275 = auVar249._0_32_;
            auVar245 = auVar281._0_32_;
            if ((((((((local_660 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_660 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_660 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_660 >> 0x7f,0) == '\0') &&
                  (local_660 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_660 >> 0xbf,0) == '\0') &&
                (local_660 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_660[0x1f]) break;
            auVar136._8_4_ = 0x7f800000;
            auVar136._0_8_ = 0x7f8000007f800000;
            auVar136._12_4_ = 0x7f800000;
            auVar136._16_4_ = 0x7f800000;
            auVar136._20_4_ = 0x7f800000;
            auVar136._24_4_ = 0x7f800000;
            auVar136._28_4_ = 0x7f800000;
            auVar103 = vblendvps_avx(auVar136,local_6c0,local_660);
            auVar132 = vshufps_avx(auVar103,auVar103,0xb1);
            auVar132 = vminps_avx(auVar103,auVar132);
            auVar14 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar14);
            auVar14 = vpermpd_avx2(auVar132,0x4e);
            auVar132 = vminps_avx(auVar132,auVar14);
            auVar132 = vcmpps_avx(auVar103,auVar132,0);
            auVar14 = local_660 & auVar132;
            auVar103 = local_660;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar103 = vandps_avx(auVar132,local_660);
            }
            uVar78 = vmovmskps_avx(auVar103);
            iVar19 = 0;
            for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            uVar80 = (ulong)(uint)(iVar19 << 2);
            *(undefined4 *)(local_660 + uVar80) = 0;
            aVar2 = (ray->dir).field_0;
            local_940._0_16_ = (undefined1  [16])aVar2;
            auVar4 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar78 = *(uint *)(local_1c0 + uVar80);
            uVar82 = *(uint *)(local_520 + uVar80);
            if (auVar4._0_4_ < 0.0) {
              fVar253 = sqrtf(auVar4._0_4_);
              auVar227 = ZEXT3264(local_a40);
              auVar281 = ZEXT3264(local_8e0);
              auVar260 = ZEXT3264(local_a20);
              auVar249 = ZEXT3264(local_8c0);
              auVar271 = ZEXT3264(local_8a0);
              uVar80 = extraout_RAX_03;
            }
            else {
              auVar4 = vsqrtss_avx(auVar4,auVar4);
              fVar253 = auVar4._0_4_;
            }
            auVar199 = vminps_avx(local_920._0_16_,local_820._0_16_);
            auVar4 = vmaxps_avx(local_920._0_16_,local_820._0_16_);
            auVar195 = vminps_avx(auVar6,_local_a80);
            auVar98 = vminps_avx(auVar199,auVar195);
            auVar199 = vmaxps_avx(auVar6,_local_a80);
            auVar195 = vmaxps_avx(auVar4,auVar199);
            local_ac0._8_4_ = 0x7fffffff;
            local_ac0._0_8_ = 0x7fffffff7fffffff;
            local_ac0._12_4_ = 0x7fffffff;
            auVar4 = vandps_avx(auVar98,local_ac0._0_16_);
            auVar199 = vandps_avx(auVar195,local_ac0._0_16_);
            auVar4 = vmaxps_avx(auVar4,auVar199);
            auVar199 = vmovshdup_avx(auVar4);
            auVar199 = vmaxss_avx(auVar199,auVar4);
            auVar4 = vshufpd_avx(auVar4,auVar4,1);
            auVar4 = vmaxss_avx(auVar4,auVar199);
            local_840._0_4_ = auVar4._0_4_ * 1.9073486e-06;
            local_960._0_4_ = fVar253 * 1.9073486e-06;
            local_760._0_16_ = vshufps_avx(auVar195,auVar195,0xff);
            auVar4 = vinsertps_avx(ZEXT416(uVar82),ZEXT416(uVar78),0x10);
            auVar236 = ZEXT1664(auVar4);
            uVar84 = 0;
            while( true ) {
              bVar77 = (byte)uVar80;
              auVar219 = ZEXT3264(local_aa0);
              if (uVar84 == 5) break;
              auVar94 = auVar236._0_16_;
              local_9c0._0_16_ = vmovshdup_avx(auVar94);
              fVar262 = 1.0 - local_9c0._0_4_;
              auVar4 = vshufps_avx(auVar94,auVar94,0x55);
              fVar253 = auVar4._0_4_;
              auVar123._0_4_ = local_820._0_4_ * fVar253;
              fVar143 = auVar4._4_4_;
              auVar123._4_4_ = local_820._4_4_ * fVar143;
              fVar261 = auVar4._8_4_;
              auVar123._8_4_ = local_820._8_4_ * fVar261;
              fVar160 = auVar4._12_4_;
              auVar123._12_4_ = local_820._12_4_ * fVar160;
              auVar148._4_4_ = fVar262;
              auVar148._0_4_ = fVar262;
              auVar148._8_4_ = fVar262;
              auVar148._12_4_ = fVar262;
              auVar4 = vfmadd231ps_fma(auVar123,auVar148,local_920._0_16_);
              auVar174._0_4_ = fVar88 * fVar253;
              auVar174._4_4_ = auVar6._4_4_ * fVar143;
              auVar174._8_4_ = auVar6._8_4_ * fVar261;
              auVar174._12_4_ = auVar6._12_4_ * fVar160;
              auVar199 = vfmadd231ps_fma(auVar174,auVar148,local_820._0_16_);
              auVar213._0_4_ = fVar253 * auVar199._0_4_;
              auVar213._4_4_ = fVar143 * auVar199._4_4_;
              auVar213._8_4_ = fVar261 * auVar199._8_4_;
              auVar213._12_4_ = fVar160 * auVar199._12_4_;
              auVar195 = vfmadd231ps_fma(auVar213,auVar148,auVar4);
              auVar124._0_4_ = fVar253 * (float)local_a80._0_4_;
              auVar124._4_4_ = fVar143 * (float)local_a80._4_4_;
              auVar124._8_4_ = fVar261 * fStack_a78;
              auVar124._12_4_ = fVar160 * fStack_a74;
              auVar4 = vfmadd231ps_fma(auVar124,auVar148,auVar6);
              auVar198._0_4_ = fVar253 * auVar4._0_4_;
              auVar198._4_4_ = fVar143 * auVar4._4_4_;
              auVar198._8_4_ = fVar261 * auVar4._8_4_;
              auVar198._12_4_ = fVar160 * auVar4._12_4_;
              auVar199 = vfmadd231ps_fma(auVar198,auVar148,auVar199);
              uVar89 = auVar236._0_4_;
              auVar125._4_4_ = uVar89;
              auVar125._0_4_ = uVar89;
              auVar125._8_4_ = uVar89;
              auVar125._12_4_ = uVar89;
              auVar4 = vfmadd213ps_fma(auVar125,local_940._0_16_,_DAT_01f45a50);
              auVar97._0_4_ = fVar253 * auVar199._0_4_;
              auVar97._4_4_ = fVar143 * auVar199._4_4_;
              auVar97._8_4_ = fVar261 * auVar199._8_4_;
              auVar97._12_4_ = fVar160 * auVar199._12_4_;
              auVar98 = vfmadd231ps_fma(auVar97,auVar195,auVar148);
              local_6e0._0_16_ = auVar98;
              auVar4 = vsubps_avx(auVar4,auVar98);
              _local_800 = auVar4;
              auVar4 = vdpps_avx(auVar4,auVar4,0x7f);
              fVar253 = auVar4._0_4_;
              if (fVar253 < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)fVar262);
                local_860._0_16_ = auVar195;
                local_880._0_16_ = auVar199;
                auVar227._0_4_ = sqrtf(fVar253);
                auVar227._4_60_ = extraout_var_00;
                auVar236 = ZEXT1664(auVar94);
                auVar98 = auVar227._0_16_;
                uVar80 = extraout_RAX_04;
                auVar199 = local_880._0_16_;
                auVar195 = local_860._0_16_;
                auVar241 = local_9e0._0_16_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar4,auVar4);
                auVar241 = ZEXT416((uint)fVar262);
              }
              auVar199 = vsubps_avx(auVar199,auVar195);
              auVar221._0_4_ = auVar199._0_4_ * 3.0;
              auVar221._4_4_ = auVar199._4_4_ * 3.0;
              auVar221._8_4_ = auVar199._8_4_ * 3.0;
              auVar221._12_4_ = auVar199._12_4_ * 3.0;
              auVar199 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar241,local_9c0._0_16_);
              auVar195 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9c0._0_16_,auVar241);
              fVar143 = auVar241._0_4_ * 6.0;
              fVar261 = auVar199._0_4_ * 6.0;
              fVar160 = auVar195._0_4_ * 6.0;
              fVar262 = local_9c0._0_4_ * 6.0;
              auVar175._0_4_ = fVar262 * (float)local_a80._0_4_;
              auVar175._4_4_ = fVar262 * (float)local_a80._4_4_;
              auVar175._8_4_ = fVar262 * fStack_a78;
              auVar175._12_4_ = fVar262 * fStack_a74;
              auVar126._4_4_ = fVar160;
              auVar126._0_4_ = fVar160;
              auVar126._8_4_ = fVar160;
              auVar126._12_4_ = fVar160;
              auVar199 = vfmadd132ps_fma(auVar126,auVar175,auVar6);
              auVar176._4_4_ = fVar261;
              auVar176._0_4_ = fVar261;
              auVar176._8_4_ = fVar261;
              auVar176._12_4_ = fVar261;
              auVar199 = vfmadd132ps_fma(auVar176,auVar199,local_820._0_16_);
              auVar195 = vdpps_avx(auVar221,auVar221,0x7f);
              auVar127._4_4_ = fVar143;
              auVar127._0_4_ = fVar143;
              auVar127._8_4_ = fVar143;
              auVar127._12_4_ = fVar143;
              auVar149 = vfmadd132ps_fma(auVar127,auVar199,local_920._0_16_);
              auVar199 = vblendps_avx(auVar195,_DAT_01f45a50,0xe);
              auVar241 = vrsqrtss_avx(auVar199,auVar199);
              fVar160 = auVar195._0_4_;
              fVar143 = auVar241._0_4_;
              auVar241 = vdpps_avx(auVar221,auVar149,0x7f);
              fVar143 = fVar143 * 1.5 + fVar160 * -0.5 * fVar143 * fVar143 * fVar143;
              auVar128._0_4_ = auVar149._0_4_ * fVar160;
              auVar128._4_4_ = auVar149._4_4_ * fVar160;
              auVar128._8_4_ = auVar149._8_4_ * fVar160;
              auVar128._12_4_ = auVar149._12_4_ * fVar160;
              fVar261 = auVar241._0_4_;
              auVar214._0_4_ = auVar221._0_4_ * fVar261;
              auVar214._4_4_ = auVar221._4_4_ * fVar261;
              auVar214._8_4_ = auVar221._8_4_ * fVar261;
              auVar214._12_4_ = auVar221._12_4_ * fVar261;
              auVar241 = vsubps_avx(auVar128,auVar214);
              auVar199 = vrcpss_avx(auVar199,auVar199);
              auVar149 = vfnmadd213ss_fma(auVar199,auVar195,ZEXT416(0x40000000));
              fVar261 = auVar199._0_4_ * auVar149._0_4_;
              auVar199 = vmaxss_avx(ZEXT416((uint)(float)local_840),
                                    ZEXT416((uint)(auVar236._0_4_ * (float)local_960._0_4_)));
              uVar68 = CONCAT44(auVar221._4_4_,auVar221._0_4_);
              auVar242._0_8_ = uVar68 ^ 0x8000000080000000;
              auVar242._8_4_ = -auVar221._8_4_;
              auVar242._12_4_ = -auVar221._12_4_;
              auVar177._0_4_ = fVar143 * auVar241._0_4_ * fVar261;
              auVar177._4_4_ = fVar143 * auVar241._4_4_ * fVar261;
              auVar177._8_4_ = fVar143 * auVar241._8_4_ * fVar261;
              auVar177._12_4_ = fVar143 * auVar241._12_4_ * fVar261;
              local_a00._0_4_ = auVar221._0_4_ * fVar143;
              local_a00._4_4_ = auVar221._4_4_ * fVar143;
              local_a00._8_4_ = auVar221._8_4_ * fVar143;
              local_a00._12_4_ = auVar221._12_4_ * fVar143;
              local_9c0._0_16_ = auVar221;
              local_9e0._0_4_ = auVar199._0_4_;
              if (fVar160 < -fVar160) {
                local_860._0_4_ = auVar98._0_4_;
                local_880._0_16_ = auVar242;
                local_900._0_16_ = auVar177;
                fVar143 = sqrtf(fVar160);
                auVar98 = ZEXT416((uint)local_860._0_4_);
                auVar199 = ZEXT416((uint)local_9e0._0_4_);
                uVar80 = extraout_RAX_05;
                auVar177 = local_900._0_16_;
                auVar242 = local_880._0_16_;
              }
              else {
                auVar195 = vsqrtss_avx(auVar195,auVar195);
                fVar143 = auVar195._0_4_;
              }
              local_860._0_16_ = vdpps_avx(_local_800,local_a00._0_16_,0x7f);
              auVar149 = vfmadd213ss_fma(ZEXT416((uint)(float)local_840),auVar98,auVar199);
              auVar199 = vdpps_avx(auVar242,local_a00._0_16_,0x7f);
              auVar195 = vdpps_avx(_local_800,auVar177,0x7f);
              auVar241 = vdpps_avx(local_940._0_16_,local_a00._0_16_,0x7f);
              auVar98 = vfmadd213ss_fma(ZEXT416((uint)(auVar98._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_840 / fVar143)),auVar149);
              local_880._0_4_ = auVar98._0_4_;
              auVar99._0_4_ = local_860._0_4_ * local_860._0_4_;
              auVar99._4_4_ = local_860._4_4_ * local_860._4_4_;
              auVar99._8_4_ = local_860._8_4_ * local_860._8_4_;
              auVar99._12_4_ = local_860._12_4_ * local_860._12_4_;
              auVar98 = vdpps_avx(_local_800,auVar242,0x7f);
              auVar254 = vsubps_avx(auVar4,auVar99);
              auVar149 = vrsqrtss_avx(auVar254,auVar254);
              fVar261 = auVar254._0_4_;
              fVar143 = auVar149._0_4_;
              fVar143 = fVar143 * 1.5 + fVar261 * -0.5 * fVar143 * fVar143 * fVar143;
              auVar149 = vdpps_avx(_local_800,local_940._0_16_,0x7f);
              local_a00._0_16_ = ZEXT416((uint)(auVar199._0_4_ + auVar195._0_4_));
              auVar199 = vfnmadd231ss_fma(auVar98,local_860._0_16_,local_a00._0_16_);
              auVar195 = vfnmadd231ss_fma(auVar149,local_860._0_16_,auVar241);
              if (fVar261 < 0.0) {
                local_900._0_16_ = auVar241;
                local_700._0_16_ = auVar199;
                local_720._0_4_ = fVar143;
                local_740._0_16_ = auVar195;
                fVar261 = sqrtf(fVar261);
                uVar80 = extraout_RAX_06;
                fVar143 = (float)local_720._0_4_;
                auVar195 = local_740._0_16_;
                auVar199 = local_700._0_16_;
                auVar241 = local_900._0_16_;
              }
              else {
                auVar98 = vsqrtss_avx(auVar254,auVar254);
                fVar261 = auVar98._0_4_;
              }
              auVar271 = ZEXT3264(local_8a0);
              auVar249 = ZEXT3264(local_8c0);
              auVar260 = ZEXT3264(local_a20);
              auVar281 = ZEXT3264(local_8e0);
              auVar227 = ZEXT3264(local_a40);
              auVar98 = vpermilps_avx(local_6e0._0_16_,0xff);
              fVar261 = fVar261 - auVar98._0_4_;
              auVar98 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xff);
              auVar199 = vfmsub213ss_fma(auVar199,ZEXT416((uint)fVar143),auVar98);
              auVar178._0_8_ = auVar241._0_8_ ^ 0x8000000080000000;
              auVar178._8_4_ = auVar241._8_4_ ^ 0x80000000;
              auVar178._12_4_ = auVar241._12_4_ ^ 0x80000000;
              auVar200._0_8_ = auVar199._0_8_ ^ 0x8000000080000000;
              auVar200._8_4_ = auVar199._8_4_ ^ 0x80000000;
              auVar200._12_4_ = auVar199._12_4_ ^ 0x80000000;
              auVar149 = ZEXT416((uint)(auVar195._0_4_ * fVar143));
              auVar195 = vfmsub231ss_fma(ZEXT416((uint)(auVar241._0_4_ * auVar199._0_4_)),
                                         local_a00._0_16_,auVar149);
              auVar199 = vinsertps_avx(auVar200,auVar149,0x1c);
              uVar89 = auVar195._0_4_;
              auVar201._4_4_ = uVar89;
              auVar201._0_4_ = uVar89;
              auVar201._8_4_ = uVar89;
              auVar201._12_4_ = uVar89;
              auVar199 = vdivps_avx(auVar199,auVar201);
              auVar195 = vinsertps_avx(local_a00._0_16_,auVar178,0x10);
              auVar195 = vdivps_avx(auVar195,auVar201);
              fVar143 = local_860._0_4_;
              auVar150._0_4_ = fVar143 * auVar199._0_4_ + fVar261 * auVar195._0_4_;
              auVar150._4_4_ = fVar143 * auVar199._4_4_ + fVar261 * auVar195._4_4_;
              auVar150._8_4_ = fVar143 * auVar199._8_4_ + fVar261 * auVar195._8_4_;
              auVar150._12_4_ = fVar143 * auVar199._12_4_ + fVar261 * auVar195._12_4_;
              auVar195 = vsubps_avx(auVar94,auVar150);
              auVar236 = ZEXT1664(auVar195);
              auVar199 = vandps_avx(local_860._0_16_,local_ac0._0_16_);
              if (auVar199._0_4_ < (float)local_880._0_4_) {
                auVar94 = vfmadd231ss_fma(ZEXT416((uint)((float)local_880._0_4_ +
                                                        (float)local_9e0._0_4_)),local_760._0_16_,
                                          ZEXT416(0x36000000));
                auVar199 = vandps_avx(ZEXT416((uint)fVar261),local_ac0._0_16_);
                if (auVar199._0_4_ < auVar94._0_4_) {
                  bVar87 = uVar84 < 5;
                  fVar143 = auVar195._0_4_ + (float)local_7e0._0_4_;
                  auVar219 = ZEXT3264(local_aa0);
                  bVar77 = 0;
                  if ((fVar143 < (ray->org).field_0.m128[3]) ||
                     (fVar261 = ray->tfar, fVar261 < fVar143)) goto LAB_013caca1;
                  auVar199 = vmovshdup_avx(auVar195);
                  fVar160 = auVar199._0_4_;
                  bVar77 = 0;
                  if ((fVar160 < 0.0) || (bVar77 = 0, 1.0 < fVar160)) goto LAB_013caca1;
                  auVar4 = vrsqrtss_avx(auVar4,auVar4);
                  fVar262 = auVar4._0_4_;
                  pGVar8 = (context->scene->geometries).items[uVar81].ptr;
                  if ((pGVar8->mask & ray->mask) == 0) {
                    bVar77 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar77 = 1, pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar253 = fVar262 * 1.5 + fVar253 * -0.5 * fVar262 * fVar262 * fVar262;
                    auVar179._0_4_ = fVar253 * (float)local_800._0_4_;
                    auVar179._4_4_ = fVar253 * (float)local_800._4_4_;
                    auVar179._8_4_ = fVar253 * fStack_7f8;
                    auVar179._12_4_ = fVar253 * fStack_7f4;
                    auVar94 = vfmadd213ps_fma(auVar98,auVar179,local_9c0._0_16_);
                    auVar4 = vshufps_avx(auVar179,auVar179,0xc9);
                    auVar199 = vshufps_avx(local_9c0._0_16_,local_9c0._0_16_,0xc9);
                    auVar180._0_4_ = auVar179._0_4_ * auVar199._0_4_;
                    auVar180._4_4_ = auVar179._4_4_ * auVar199._4_4_;
                    auVar180._8_4_ = auVar179._8_4_ * auVar199._8_4_;
                    auVar180._12_4_ = auVar179._12_4_ * auVar199._12_4_;
                    auVar98 = vfmsub231ps_fma(auVar180,local_9c0._0_16_,auVar4);
                    auVar4 = vshufps_avx(auVar98,auVar98,0xc9);
                    auVar199 = vshufps_avx(auVar94,auVar94,0xc9);
                    auVar98 = vshufps_avx(auVar98,auVar98,0xd2);
                    auVar100._0_4_ = auVar94._0_4_ * auVar98._0_4_;
                    auVar100._4_4_ = auVar94._4_4_ * auVar98._4_4_;
                    auVar100._8_4_ = auVar94._8_4_ * auVar98._8_4_;
                    auVar100._12_4_ = auVar94._12_4_ * auVar98._12_4_;
                    auVar199 = vfmsub231ps_fma(auVar100,auVar4,auVar199);
                    auVar4 = vshufps_avx(auVar199,auVar199,0xe9);
                    local_9a0 = vmovlps_avx(auVar4);
                    local_998 = auVar199._0_4_;
                    local_990 = 0;
                    local_98c = (undefined4)local_968;
                    local_984 = context->user->instID[0];
                    local_980 = context->user->instPrimID[0];
                    ray->tfar = fVar143;
                    local_ac4 = -1;
                    local_a70.valid = &local_ac4;
                    local_a70.geometryUserPtr = pGVar8->userPtr;
                    local_a70.context = context->user;
                    local_a70.hit = (RTCHitN *)&local_9a0;
                    local_a70.N = 1;
                    local_a70.ray = (RTCRayN *)ray;
                    local_994 = fVar160;
                    local_988 = uVar81;
                    if (pGVar8->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_013cae9e:
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar236 = ZEXT1664(auVar236._0_16_);
                        (*p_Var12)(&local_a70);
                        if (*local_a70.valid == 0) goto LAB_013caeef;
                      }
                      bVar77 = 1;
                    }
                    else {
                      auVar236 = ZEXT1664(auVar195);
                      (*pGVar8->occlusionFilterN)(&local_a70);
                      if (*local_a70.valid != 0) goto LAB_013cae9e;
LAB_013caeef:
                      ray->tfar = fVar261;
                      bVar77 = 0;
                    }
                    auVar271 = ZEXT3264(local_8a0);
                    auVar249 = ZEXT3264(local_8c0);
                    auVar260 = ZEXT3264(local_a20);
                    auVar281 = ZEXT3264(local_8e0);
                    auVar219 = ZEXT3264(local_aa0);
                    auVar227 = ZEXT3264(local_a40);
                    goto LAB_013caca1;
                  }
                  auVar219 = ZEXT3264(local_aa0);
                  goto LAB_013caca1;
                }
              }
              uVar84 = uVar84 + 1;
            }
            bVar87 = false;
LAB_013caca1:
            bVar86 = bVar86 | bVar87 & bVar77;
            fVar253 = ray->tfar;
            auVar113._4_4_ = fVar253;
            auVar113._0_4_ = fVar253;
            auVar113._8_4_ = fVar253;
            auVar113._12_4_ = fVar253;
            auVar113._16_4_ = fVar253;
            auVar113._20_4_ = fVar253;
            auVar113._24_4_ = fVar253;
            auVar113._28_4_ = fVar253;
            fVar143 = ray->tfar;
            auVar103 = vcmpps_avx(_local_780,auVar113,2);
            local_660 = vandps_avx(auVar103,local_660);
          }
          auVar159._0_4_ = (float)local_680._0_4_ + local_500._0_4_;
          auVar159._4_4_ = (float)local_680._4_4_ + local_500._4_4_;
          auVar159._8_4_ = fStack_678 + local_500._8_4_;
          auVar159._12_4_ = fStack_674 + local_500._12_4_;
          auVar159._16_4_ = fStack_670 + local_500._16_4_;
          auVar159._20_4_ = fStack_66c + local_500._20_4_;
          auVar159._24_4_ = fStack_668 + local_500._24_4_;
          auVar159._28_4_ = fStack_664 + local_500._28_4_;
          auVar188._4_4_ = fVar143;
          auVar188._0_4_ = fVar143;
          auVar188._8_4_ = fVar143;
          auVar188._12_4_ = fVar143;
          auVar188._16_4_ = fVar143;
          auVar188._20_4_ = fVar143;
          auVar188._24_4_ = fVar143;
          auVar188._28_4_ = fVar143;
          auVar132 = vcmpps_avx(auVar159,auVar188,2);
          auVar103 = vandps_avx(local_600,local_5e0);
          auVar103 = vandps_avx(auVar132,auVar103);
          auVar208._0_4_ = (float)local_680._0_4_ + local_540._0_4_;
          auVar208._4_4_ = (float)local_680._4_4_ + local_540._4_4_;
          auVar208._8_4_ = fStack_678 + local_540._8_4_;
          auVar208._12_4_ = fStack_674 + local_540._12_4_;
          auVar208._16_4_ = fStack_670 + local_540._16_4_;
          auVar208._20_4_ = fStack_66c + local_540._20_4_;
          auVar208._24_4_ = fStack_668 + local_540._24_4_;
          auVar208._28_4_ = fStack_664 + local_540._28_4_;
          auVar14 = vcmpps_avx(auVar208,auVar188,2);
          auVar132 = vandps_avx(local_7c0,_local_7a0);
          auVar132 = vandps_avx(auVar14,auVar132);
          auVar132 = vorps_avx(auVar103,auVar132);
          if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar132 >> 0x7f,0) != '\0') ||
                (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0xbf,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar132[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar79 * 0x60) = auVar132;
            auVar103 = vblendvps_avx(_local_540,local_500,auVar103);
            *(undefined1 (*) [32])(auStack_160 + uVar79 * 0x60) = auVar103;
            uVar80 = vmovlps_avx(local_550);
            (&uStack_140)[uVar79 * 0xc] = uVar80;
            aiStack_138[uVar79 * 0x18] = local_b84 + 1;
            uVar79 = (ulong)((int)uVar79 + 1);
          }
          auVar260 = ZEXT3264(auVar260._0_32_);
          goto LAB_013c9aee;
        }
      }
      auVar271 = ZEXT3264(local_8a0);
      auVar260 = ZEXT3264(local_a20);
      auVar219 = ZEXT3264(local_aa0);
      auVar227 = ZEXT3264(local_a40);
    }
LAB_013c9aee:
    fVar253 = ray->tfar;
    auVar106._4_4_ = fVar253;
    auVar106._0_4_ = fVar253;
    auVar106._8_4_ = fVar253;
    auVar106._12_4_ = fVar253;
    auVar106._16_4_ = fVar253;
    auVar106._20_4_ = fVar253;
    auVar106._24_4_ = fVar253;
    auVar106._28_4_ = fVar253;
    while( true ) {
      uVar78 = (uint)uVar79;
      if (uVar78 == 0) {
        if (bVar86 != 0) goto LAB_013cb122;
        auVar103 = vcmpps_avx(local_3c0,auVar106,2);
        uVar81 = vmovmskps_avx(auVar103);
        uVar81 = uVar81 & (uint)local_7c8 - 1 & (uint)local_7c8;
        goto LAB_013c8b9e;
      }
      uVar79 = (ulong)(uVar78 - 1);
      lVar83 = uVar79 * 0x60;
      auVar103 = *(undefined1 (*) [32])(auStack_160 + lVar83);
      auVar131._0_4_ = auVar103._0_4_ + (float)local_680._0_4_;
      auVar131._4_4_ = auVar103._4_4_ + (float)local_680._4_4_;
      auVar131._8_4_ = auVar103._8_4_ + fStack_678;
      auVar131._12_4_ = auVar103._12_4_ + fStack_674;
      auVar131._16_4_ = auVar103._16_4_ + fStack_670;
      auVar131._20_4_ = auVar103._20_4_ + fStack_66c;
      auVar131._24_4_ = auVar103._24_4_ + fStack_668;
      auVar131._28_4_ = auVar103._28_4_ + fStack_664;
      auVar14 = vcmpps_avx(auVar131,auVar106,2);
      auVar132 = vandps_avx(auVar14,*(undefined1 (*) [32])(auStack_180 + lVar83));
      local_500 = auVar132;
      auVar14 = *(undefined1 (*) [32])(auStack_180 + lVar83) & auVar14;
      if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0x7f,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0xbf,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar14[0x1f] < '\0') break;
      uVar79 = (ulong)(uVar78 - 1);
    }
    auVar107._8_4_ = 0x7f800000;
    auVar107._0_8_ = 0x7f8000007f800000;
    auVar107._12_4_ = 0x7f800000;
    auVar107._16_4_ = 0x7f800000;
    auVar107._20_4_ = 0x7f800000;
    auVar107._24_4_ = 0x7f800000;
    auVar107._28_4_ = 0x7f800000;
    auVar103 = vblendvps_avx(auVar107,auVar103,auVar132);
    auVar14 = vshufps_avx(auVar103,auVar103,0xb1);
    auVar14 = vminps_avx(auVar103,auVar14);
    auVar15 = vshufpd_avx(auVar14,auVar14,5);
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar15 = vpermpd_avx2(auVar14,0x4e);
    auVar14 = vminps_avx(auVar14,auVar15);
    auVar103 = vcmpps_avx(auVar103,auVar14,0);
    auVar14 = auVar132 & auVar103;
    if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar14 >> 0x7f,0) != '\0') ||
          (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0xbf,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0')
    {
      auVar132 = vandps_avx(auVar103,auVar132);
    }
    uVar82 = vmovmskps_avx(auVar132);
    iVar19 = 0;
    for (; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
      iVar19 = iVar19 + 1;
    }
    *(undefined4 *)(local_500 + (uint)(iVar19 << 2)) = 0;
    uVar80 = (&uStack_140)[uVar79 * 0xc];
    auVar92._8_8_ = 0;
    auVar92._0_8_ = uVar80;
    local_b84 = aiStack_138[uVar79 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar83) = local_500;
    uVar82 = uVar78 - 1;
    if ((((((((local_500 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_500 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_500 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_500 >> 0x7f,0) != '\0') ||
          (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_500 >> 0xbf,0) != '\0') ||
        (local_500 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_500[0x1f] < '\0') {
      uVar82 = uVar78;
    }
    uVar89 = (undefined4)uVar80;
    auVar133._4_4_ = uVar89;
    auVar133._0_4_ = uVar89;
    auVar133._8_4_ = uVar89;
    auVar133._12_4_ = uVar89;
    auVar133._16_4_ = uVar89;
    auVar133._20_4_ = uVar89;
    auVar133._24_4_ = uVar89;
    auVar133._28_4_ = uVar89;
    auVar4 = vmovshdup_avx(auVar92);
    auVar4 = vsubps_avx(auVar4,auVar92);
    auVar108._0_4_ = auVar4._0_4_;
    auVar108._4_4_ = auVar108._0_4_;
    auVar108._8_4_ = auVar108._0_4_;
    auVar108._12_4_ = auVar108._0_4_;
    auVar108._16_4_ = auVar108._0_4_;
    auVar108._20_4_ = auVar108._0_4_;
    auVar108._24_4_ = auVar108._0_4_;
    auVar108._28_4_ = auVar108._0_4_;
    auVar4 = vfmadd132ps_fma(auVar108,auVar133,_DAT_01f7b040);
    _local_540 = ZEXT1632(auVar4);
    local_550._8_8_ = 0;
    local_550._0_8_ = *(ulong *)(local_540 + (uint)(iVar19 << 2));
    uVar79 = (ulong)uVar82;
    auVar238 = auVar260._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }